

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  void *pvVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  long lVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  bool bVar68;
  bool bVar69;
  float fVar70;
  float fVar84;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined4 uVar71;
  undefined1 auVar79 [16];
  undefined1 auVar83 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar102;
  vint4 bi_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar101;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 extraout_var [56];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 ai_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar144;
  vint4 ai;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar145;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar146;
  float fVar162;
  float fVar163;
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar164;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar165;
  float fVar166;
  float fVar167;
  undefined8 uVar168;
  float fVar188;
  vfloat4 b0_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar186;
  float fVar190;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar185 [32];
  float fVar195;
  float fVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  float fVar210;
  float fVar228;
  vint4 ai_1;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  float fVar229;
  float fVar239;
  vfloat4 a0_2;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  float fVar250;
  float fVar251;
  vfloat4 a0_3;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar252;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  float fVar264;
  float fVar277;
  float fVar278;
  vfloat4 a0_1;
  undefined1 auVar265 [16];
  float fVar279;
  undefined1 auVar266 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar267 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  vfloat4 a0;
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar281 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [16];
  undefined1 auVar304 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar305 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_7a1;
  undefined1 local_7a0 [16];
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined4 local_5b0;
  undefined4 local_5a0;
  uint auStack_520 [4];
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar62;
  undefined1 auVar126 [32];
  
  PVar2 = prim[1];
  uVar67 = (ulong)(byte)PVar2;
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar70 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar72._0_4_ = fVar70 * auVar7._0_4_;
  auVar72._4_4_ = fVar70 * auVar7._4_4_;
  auVar72._8_4_ = fVar70 * auVar7._8_4_;
  auVar72._12_4_ = fVar70 * auVar7._12_4_;
  auVar147._0_4_ = fVar70 * auVar8._0_4_;
  auVar147._4_4_ = fVar70 * auVar8._4_4_;
  auVar147._8_4_ = fVar70 * auVar8._8_4_;
  auVar147._12_4_ = fVar70 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar295 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar295 = vcvtdq2ps_avx(auVar295);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar67 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar61 = (ulong)(uint)((int)(uVar67 * 9) * 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + uVar67 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar61 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar290._4_4_ = auVar147._0_4_;
  auVar290._0_4_ = auVar147._0_4_;
  auVar290._8_4_ = auVar147._0_4_;
  auVar290._12_4_ = auVar147._0_4_;
  auVar86 = vshufps_avx(auVar147,auVar147,0x55);
  auVar73 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar70 = auVar73._0_4_;
  auVar256._0_4_ = fVar70 * auVar295._0_4_;
  fVar84 = auVar73._4_4_;
  auVar256._4_4_ = fVar84 * auVar295._4_4_;
  fVar146 = auVar73._8_4_;
  auVar256._8_4_ = fVar146 * auVar295._8_4_;
  fVar162 = auVar73._12_4_;
  auVar256._12_4_ = fVar162 * auVar295._12_4_;
  auVar135._0_4_ = auVar11._0_4_ * fVar70;
  auVar135._4_4_ = auVar11._4_4_ * fVar84;
  auVar135._8_4_ = auVar11._8_4_ * fVar146;
  auVar135._12_4_ = auVar11._12_4_ * fVar162;
  auVar211._0_4_ = auVar103._0_4_ * fVar70;
  auVar211._4_4_ = auVar103._4_4_ * fVar84;
  auVar211._8_4_ = auVar103._8_4_ * fVar146;
  auVar211._12_4_ = auVar103._12_4_ * fVar162;
  auVar73 = vfmadd231ps_fma(auVar256,auVar86,auVar8);
  auVar87 = vfmadd231ps_fma(auVar135,auVar86,auVar10);
  auVar86 = vfmadd231ps_fma(auVar211,auVar74,auVar86);
  auVar116 = vfmadd231ps_fma(auVar73,auVar290,auVar7);
  auVar87 = vfmadd231ps_fma(auVar87,auVar290,auVar9);
  auVar130 = vfmadd231ps_fma(auVar86,auVar75,auVar290);
  auVar291._4_4_ = auVar72._0_4_;
  auVar291._0_4_ = auVar72._0_4_;
  auVar291._8_4_ = auVar72._0_4_;
  auVar291._12_4_ = auVar72._0_4_;
  auVar86 = vshufps_avx(auVar72,auVar72,0x55);
  auVar73 = vshufps_avx(auVar72,auVar72,0xaa);
  fVar70 = auVar73._0_4_;
  auVar148._0_4_ = fVar70 * auVar295._0_4_;
  fVar84 = auVar73._4_4_;
  auVar148._4_4_ = fVar84 * auVar295._4_4_;
  fVar146 = auVar73._8_4_;
  auVar148._8_4_ = fVar146 * auVar295._8_4_;
  fVar162 = auVar73._12_4_;
  auVar148._12_4_ = fVar162 * auVar295._12_4_;
  auVar85._0_4_ = auVar11._0_4_ * fVar70;
  auVar85._4_4_ = auVar11._4_4_ * fVar84;
  auVar85._8_4_ = auVar11._8_4_ * fVar146;
  auVar85._12_4_ = auVar11._12_4_ * fVar162;
  auVar73._0_4_ = auVar103._0_4_ * fVar70;
  auVar73._4_4_ = auVar103._4_4_ * fVar84;
  auVar73._8_4_ = auVar103._8_4_ * fVar146;
  auVar73._12_4_ = auVar103._12_4_ * fVar162;
  auVar8 = vfmadd231ps_fma(auVar148,auVar86,auVar8);
  auVar295 = vfmadd231ps_fma(auVar85,auVar86,auVar10);
  auVar10 = vfmadd231ps_fma(auVar73,auVar86,auVar74);
  auVar11 = vfmadd231ps_fma(auVar8,auVar291,auVar7);
  auVar74 = vfmadd231ps_fma(auVar295,auVar291,auVar9);
  auVar103 = vfmadd231ps_fma(auVar10,auVar291,auVar75);
  auVar196._8_4_ = 0x7fffffff;
  auVar196._0_8_ = 0x7fffffff7fffffff;
  auVar196._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar116,auVar196);
  auVar108._8_4_ = 0x219392ef;
  auVar108._0_8_ = 0x219392ef219392ef;
  auVar108._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar108,1);
  auVar8 = vblendvps_avx(auVar116,auVar108,auVar7);
  auVar7 = vandps_avx(auVar87,auVar196);
  auVar7 = vcmpps_avx(auVar7,auVar108,1);
  auVar295 = vblendvps_avx(auVar87,auVar108,auVar7);
  auVar7 = vandps_avx(auVar130,auVar196);
  auVar7 = vcmpps_avx(auVar7,auVar108,1);
  auVar7 = vblendvps_avx(auVar130,auVar108,auVar7);
  auVar9 = vrcpps_avx(auVar8);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = &DAT_3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar217);
  auVar9 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8 = vrcpps_avx(auVar295);
  auVar295 = vfnmadd213ps_fma(auVar295,auVar8,auVar217);
  auVar10 = vfmadd132ps_fma(auVar295,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar295 = vfnmadd213ps_fma(auVar7,auVar8,auVar217);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar75 = vfmadd132ps_fma(auVar295,auVar8,auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar11);
  auVar130._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar130._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar130._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar130._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar11);
  auVar149._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar149._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar149._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar149._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar87._1_3_ = 0;
  auVar87[0] = PVar2;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar295);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar67 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar74);
  auVar212._0_4_ = auVar7._0_4_ * auVar10._0_4_;
  auVar212._4_4_ = auVar7._4_4_ * auVar10._4_4_;
  auVar212._8_4_ = auVar7._8_4_ * auVar10._8_4_;
  auVar212._12_4_ = auVar7._12_4_ * auVar10._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar74);
  auVar86._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar86._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar86._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar86._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar61 + uVar67 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar103);
  auVar116._0_4_ = auVar75._0_4_ * auVar7._0_4_;
  auVar116._4_4_ = auVar75._4_4_ * auVar7._4_4_;
  auVar116._8_4_ = auVar75._8_4_ * auVar7._8_4_;
  auVar116._12_4_ = auVar75._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar103);
  auVar74._0_4_ = auVar75._0_4_ * auVar7._0_4_;
  auVar74._4_4_ = auVar75._4_4_ * auVar7._4_4_;
  auVar74._8_4_ = auVar75._8_4_ * auVar7._8_4_;
  auVar74._12_4_ = auVar75._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar130,auVar149);
  auVar8 = vpminsd_avx(auVar212,auVar86);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar116,auVar74);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar230._4_4_ = uVar71;
  auVar230._0_4_ = uVar71;
  auVar230._8_4_ = uVar71;
  auVar230._12_4_ = uVar71;
  auVar8 = vmaxps_avx(auVar8,auVar230);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_460._0_4_ = auVar7._0_4_ * 0.99999964;
  local_460._4_4_ = auVar7._4_4_ * 0.99999964;
  local_460._8_4_ = auVar7._8_4_ * 0.99999964;
  local_460._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar130,auVar149);
  auVar8 = vpmaxsd_avx(auVar212,auVar86);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar116,auVar74);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar103._4_4_ = uVar71;
  auVar103._0_4_ = uVar71;
  auVar103._8_4_ = uVar71;
  auVar103._12_4_ = uVar71;
  auVar8 = vminps_avx(auVar8,auVar103);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar75._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar87[4] = PVar2;
  auVar87._5_3_ = 0;
  auVar87[8] = PVar2;
  auVar87._9_3_ = 0;
  auVar87[0xc] = PVar2;
  auVar87._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar87,_DAT_01ff0cf0);
  auVar7 = vcmpps_avx(local_460,auVar75,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar57 = vmovmskps_avx(auVar7);
  local_7a1 = uVar57 != 0;
  if (uVar57 == 0) {
    return local_7a1;
  }
  uVar57 = uVar57 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  iVar58 = 1 << ((uint)k & 0x1f);
  auVar82._4_4_ = iVar58;
  auVar82._0_4_ = iVar58;
  auVar82._8_4_ = iVar58;
  auVar82._12_4_ = iVar58;
  auVar82._16_4_ = iVar58;
  auVar82._20_4_ = iVar58;
  auVar82._24_4_ = iVar58;
  auVar82._28_4_ = iVar58;
  auVar83 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar81 = vpand_avx2(auVar82,auVar83);
  local_360 = vpcmpeqd_avx2(auVar81,auVar83);
LAB_0165b20c:
  lVar63 = 0;
  uVar67 = (ulong)uVar57;
  for (uVar61 = uVar67; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar63 = lVar63 + 1;
  }
  uVar57 = *(uint *)(prim + 2);
  local_340 = *(uint *)(prim + lVar63 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar57].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_340);
  p_Var4 = pGVar3[1].intersectionFilterN;
  pvVar5 = pGVar3[2].userPtr;
  _Var6 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var6 + uVar61 * (long)pvVar5);
  auVar8 = *(undefined1 (*) [16])(_Var6 + (uVar61 + 1) * (long)pvVar5);
  auVar295 = *(undefined1 (*) [16])(_Var6 + (uVar61 + 2) * (long)pvVar5);
  auVar9 = *(undefined1 (*) [16])(_Var6 + (long)pvVar5 * (uVar61 + 3));
  lVar63 = *(long *)&pGVar3[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar63 + (long)p_Var4 * uVar61);
  auVar11 = *(undefined1 (*) [16])(lVar63 + (long)p_Var4 * (uVar61 + 1));
  auVar75 = *(undefined1 (*) [16])(lVar63 + (long)p_Var4 * (uVar61 + 2));
  uVar67 = uVar67 - 1 & uVar67;
  auVar74 = *(undefined1 (*) [16])(lVar63 + (long)p_Var4 * (uVar61 + 3));
  if (uVar67 != 0) {
    uVar66 = uVar67 - 1 & uVar67;
    for (uVar61 = uVar67; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar66 != 0) {
      for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar130 = ZEXT816(0) << 0x40;
  auVar88._0_4_ = auVar74._0_4_ * 0.0;
  auVar88._4_4_ = auVar74._4_4_ * 0.0;
  auVar88._8_4_ = auVar74._8_4_ * 0.0;
  auVar88._12_4_ = auVar74._12_4_ * 0.0;
  auVar73 = vfmadd231ps_fma(auVar88,auVar75,auVar130);
  auVar86 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar73);
  local_6f0._0_4_ = auVar10._0_4_ + auVar86._0_4_;
  local_6f0._4_4_ = auVar10._4_4_ + auVar86._4_4_;
  fStack_6e8 = auVar10._8_4_ + auVar86._8_4_;
  fStack_6e4 = auVar10._12_4_ + auVar86._12_4_;
  auVar292._8_4_ = 0x40400000;
  auVar292._0_8_ = 0x4040000040400000;
  auVar292._12_4_ = 0x40400000;
  auVar86 = vfmadd231ps_fma(auVar73,auVar11,auVar292);
  auVar87 = vfnmadd231ps_fma(auVar86,auVar10,auVar292);
  auVar265._0_4_ = auVar9._0_4_ * 0.0;
  auVar265._4_4_ = auVar9._4_4_ * 0.0;
  auVar265._8_4_ = auVar9._8_4_ * 0.0;
  auVar265._12_4_ = auVar9._12_4_ * 0.0;
  auVar73 = vfmadd231ps_fma(auVar265,auVar295,auVar130);
  auVar86 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar8,auVar73);
  auVar280._0_4_ = auVar7._0_4_ + auVar86._0_4_;
  auVar280._4_4_ = auVar7._4_4_ + auVar86._4_4_;
  auVar280._8_4_ = auVar7._8_4_ + auVar86._8_4_;
  auVar280._12_4_ = auVar7._12_4_ + auVar86._12_4_;
  auVar86 = vfmadd231ps_fma(auVar73,auVar8,auVar292);
  auVar73 = vfnmadd231ps_fma(auVar86,auVar7,auVar292);
  auVar86 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar75,auVar74);
  auVar86 = vfmadd231ps_fma(auVar86,auVar11,auVar130);
  auVar86 = vfmadd231ps_fma(auVar86,auVar10,auVar130);
  auVar131._0_4_ = auVar74._0_4_ * 3.0;
  auVar131._4_4_ = auVar74._4_4_ * 3.0;
  auVar131._8_4_ = auVar74._8_4_ * 3.0;
  auVar131._12_4_ = auVar74._12_4_ * 3.0;
  auVar75 = vfnmadd231ps_fma(auVar131,auVar292,auVar75);
  auVar11 = vfmadd231ps_fma(auVar75,auVar130,auVar11);
  auVar116 = vfnmadd231ps_fma(auVar11,auVar130,auVar10);
  auVar10 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar295,auVar9);
  auVar10 = vfmadd231ps_fma(auVar10,auVar8,auVar130);
  auVar10 = vfmadd231ps_fma(auVar10,auVar7,auVar130);
  auVar240._0_4_ = auVar9._0_4_ * 3.0;
  auVar240._4_4_ = auVar9._4_4_ * 3.0;
  auVar240._8_4_ = auVar9._8_4_ * 3.0;
  auVar240._12_4_ = auVar9._12_4_ * 3.0;
  auVar295 = vfnmadd231ps_fma(auVar240,auVar292,auVar295);
  auVar8 = vfmadd231ps_fma(auVar295,auVar130,auVar8);
  auVar11 = vfnmadd231ps_fma(auVar8,auVar130,auVar7);
  auVar7 = vshufps_avx(auVar87,auVar87,0xc9);
  auVar8 = vshufps_avx(auVar280,auVar280,0xc9);
  fVar163 = auVar87._0_4_;
  auVar169._0_4_ = fVar163 * auVar8._0_4_;
  fVar164 = auVar87._4_4_;
  auVar169._4_4_ = fVar164 * auVar8._4_4_;
  fVar101 = auVar87._8_4_;
  auVar169._8_4_ = fVar101 * auVar8._8_4_;
  fVar102 = auVar87._12_4_;
  auVar169._12_4_ = fVar102 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar169,auVar7,auVar280);
  auVar295 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar170._0_4_ = fVar163 * auVar8._0_4_;
  auVar170._4_4_ = fVar164 * auVar8._4_4_;
  auVar170._8_4_ = fVar101 * auVar8._8_4_;
  auVar170._12_4_ = fVar102 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar170,auVar7,auVar73);
  auVar9 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vshufps_avx(auVar116,auVar116,0xc9);
  auVar8 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar167 = auVar116._0_4_;
  auVar150._0_4_ = fVar167 * auVar8._0_4_;
  fVar129 = auVar116._4_4_;
  auVar150._4_4_ = fVar129 * auVar8._4_4_;
  fVar144 = auVar116._8_4_;
  auVar150._8_4_ = fVar144 * auVar8._8_4_;
  fVar145 = auVar116._12_4_;
  auVar150._12_4_ = fVar145 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar150,auVar7,auVar10);
  auVar10 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar197._0_4_ = fVar167 * auVar8._0_4_;
  auVar197._4_4_ = fVar129 * auVar8._4_4_;
  auVar197._8_4_ = fVar144 * auVar8._8_4_;
  auVar197._12_4_ = fVar145 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar197,auVar7,auVar11);
  auVar11 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vdpps_avx(auVar295,auVar295,0x7f);
  fVar84 = auVar7._0_4_;
  auVar241._4_12_ = ZEXT812(0) << 0x20;
  auVar241._0_4_ = fVar84;
  auVar8 = vrsqrtss_avx(auVar241,auVar241);
  fVar70 = auVar8._0_4_;
  fVar146 = fVar70 * 1.5 - fVar84 * 0.5 * fVar70 * fVar70 * fVar70;
  auVar8 = vdpps_avx(auVar295,auVar9,0x7f);
  fVar165 = auVar295._0_4_ * fVar146;
  fVar186 = auVar295._4_4_ * fVar146;
  fVar188 = auVar295._8_4_ * fVar146;
  fVar190 = auVar295._12_4_ * fVar146;
  auVar257._0_4_ = auVar9._0_4_ * fVar84;
  auVar257._4_4_ = auVar9._4_4_ * fVar84;
  auVar257._8_4_ = auVar9._8_4_ * fVar84;
  auVar257._12_4_ = auVar9._12_4_ * fVar84;
  fVar70 = auVar8._0_4_;
  auVar213._0_4_ = auVar295._0_4_ * fVar70;
  auVar213._4_4_ = auVar295._4_4_ * fVar70;
  auVar213._8_4_ = auVar295._8_4_ * fVar70;
  auVar213._12_4_ = auVar295._12_4_ * fVar70;
  auVar295 = vsubps_avx(auVar257,auVar213);
  auVar8 = vrcpss_avx(auVar241,auVar241);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar70 = auVar8._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar84 = auVar7._0_4_;
  auVar242._4_12_ = ZEXT812(0) << 0x20;
  auVar242._0_4_ = fVar84;
  auVar8 = vrsqrtss_avx(auVar242,auVar242);
  fVar162 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar10,auVar11,0x7f);
  fVar162 = fVar162 * 1.5 - fVar84 * 0.5 * fVar162 * fVar162 * fVar162;
  fVar264 = fVar162 * auVar10._0_4_;
  fVar277 = fVar162 * auVar10._4_4_;
  fVar278 = fVar162 * auVar10._8_4_;
  fVar279 = fVar162 * auVar10._12_4_;
  auVar198._0_4_ = fVar84 * auVar11._0_4_;
  auVar198._4_4_ = fVar84 * auVar11._4_4_;
  auVar198._8_4_ = fVar84 * auVar11._8_4_;
  auVar198._12_4_ = fVar84 * auVar11._12_4_;
  fVar84 = auVar8._0_4_;
  auVar151._0_4_ = fVar84 * auVar10._0_4_;
  auVar151._4_4_ = fVar84 * auVar10._4_4_;
  auVar151._8_4_ = fVar84 * auVar10._8_4_;
  auVar151._12_4_ = fVar84 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar198,auVar151);
  auVar8 = vrcpss_avx(auVar242,auVar242);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,ZEXT416(0x40000000));
  fVar84 = auVar7._0_4_ * auVar8._0_4_;
  auVar7 = vshufps_avx(_local_6f0,_local_6f0,0xff);
  auVar231._0_4_ = auVar7._0_4_ * fVar165;
  auVar231._4_4_ = auVar7._4_4_ * fVar186;
  auVar231._8_4_ = auVar7._8_4_ * fVar188;
  auVar231._12_4_ = auVar7._12_4_ * fVar190;
  auVar75 = vsubps_avx(_local_6f0,auVar231);
  auVar8 = vshufps_avx(auVar87,auVar87,0xff);
  auVar171._0_4_ = auVar8._0_4_ * fVar165 + fVar146 * auVar295._0_4_ * fVar70 * auVar7._0_4_;
  auVar171._4_4_ = auVar8._4_4_ * fVar186 + fVar146 * auVar295._4_4_ * fVar70 * auVar7._4_4_;
  auVar171._8_4_ = auVar8._8_4_ * fVar188 + fVar146 * auVar295._8_4_ * fVar70 * auVar7._8_4_;
  auVar171._12_4_ = auVar8._12_4_ * fVar190 + fVar146 * auVar295._12_4_ * fVar70 * auVar7._12_4_;
  auVar295 = vsubps_avx(auVar87,auVar171);
  auVar243._0_4_ = auVar231._0_4_ + (float)local_6f0._0_4_;
  auVar243._4_4_ = auVar231._4_4_ + (float)local_6f0._4_4_;
  auVar243._8_4_ = auVar231._8_4_ + fStack_6e8;
  auVar243._12_4_ = auVar231._12_4_ + fStack_6e4;
  auVar7 = vshufps_avx(auVar86,auVar86,0xff);
  auVar104._0_4_ = fVar264 * auVar7._0_4_;
  auVar104._4_4_ = fVar277 * auVar7._4_4_;
  auVar104._8_4_ = fVar278 * auVar7._8_4_;
  auVar104._12_4_ = fVar279 * auVar7._12_4_;
  auVar74 = vsubps_avx(auVar86,auVar104);
  auVar8 = vshufps_avx(auVar116,auVar116,0xff);
  auVar89._0_4_ = fVar264 * auVar8._0_4_ + auVar7._0_4_ * fVar162 * auVar9._0_4_ * fVar84;
  auVar89._4_4_ = fVar277 * auVar8._4_4_ + auVar7._4_4_ * fVar162 * auVar9._4_4_ * fVar84;
  auVar89._8_4_ = fVar278 * auVar8._8_4_ + auVar7._8_4_ * fVar162 * auVar9._8_4_ * fVar84;
  auVar89._12_4_ = fVar279 * auVar8._12_4_ + auVar7._12_4_ * fVar162 * auVar9._12_4_ * fVar84;
  auVar7 = vsubps_avx(auVar116,auVar89);
  fVar165 = auVar86._0_4_ + auVar104._0_4_;
  fVar186 = auVar86._4_4_ + auVar104._4_4_;
  fVar188 = auVar86._8_4_ + auVar104._8_4_;
  fVar190 = auVar86._12_4_ + auVar104._12_4_;
  auVar117._0_4_ = auVar75._0_4_ + auVar295._0_4_ * 0.33333334;
  auVar117._4_4_ = auVar75._4_4_ + auVar295._4_4_ * 0.33333334;
  auVar117._8_4_ = auVar75._8_4_ + auVar295._8_4_ * 0.33333334;
  auVar117._12_4_ = auVar75._12_4_ + auVar295._12_4_ * 0.33333334;
  auVar90._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar90._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar90._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar90._12_4_ = auVar7._12_4_ * 0.33333334;
  auVar86 = vsubps_avx(auVar74,auVar90);
  auVar73 = vsubps_avx(auVar75,auVar103);
  auVar7 = vshufps_avx(auVar73,auVar73,0x55);
  auVar8 = vshufps_avx(auVar73,auVar73,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar70 = pre->ray_space[k].vz.field_0.m128[0];
  fVar84 = pre->ray_space[k].vz.field_0.m128[1];
  fVar146 = pre->ray_space[k].vz.field_0.m128[2];
  fVar162 = pre->ray_space[k].vz.field_0.m128[3];
  auVar91._0_4_ = fVar70 * auVar8._0_4_;
  auVar91._4_4_ = fVar84 * auVar8._4_4_;
  auVar91._8_4_ = fVar146 * auVar8._8_4_;
  auVar91._12_4_ = fVar162 * auVar8._12_4_;
  auVar295 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar1,auVar7);
  auVar87 = vsubps_avx(auVar117,auVar103);
  auVar7 = vshufps_avx(auVar87,auVar87,0x55);
  auVar8 = vshufps_avx(auVar87,auVar87,0xaa);
  auVar300._0_4_ = fVar70 * auVar8._0_4_;
  auVar300._4_4_ = fVar84 * auVar8._4_4_;
  auVar300._8_4_ = fVar146 * auVar8._8_4_;
  auVar300._12_4_ = fVar162 * auVar8._12_4_;
  auVar8 = vfmadd231ps_fma(auVar300,(undefined1  [16])aVar1,auVar7);
  local_3f0 = vsubps_avx(auVar86,auVar103);
  auVar7 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar266._0_4_ = fVar70 * auVar7._0_4_;
  auVar266._4_4_ = fVar84 * auVar7._4_4_;
  auVar266._8_4_ = fVar146 * auVar7._8_4_;
  auVar266._12_4_ = fVar162 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar9 = vfmadd231ps_fma(auVar266,(undefined1  [16])aVar1,auVar7);
  local_400 = vsubps_avx(auVar74,auVar103);
  auVar7 = vshufps_avx(local_400,local_400,0xaa);
  auVar293._0_4_ = fVar70 * auVar7._0_4_;
  auVar293._4_4_ = fVar84 * auVar7._4_4_;
  auVar293._8_4_ = fVar146 * auVar7._8_4_;
  auVar293._12_4_ = fVar162 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_400,local_400,0x55);
  auVar10 = vfmadd231ps_fma(auVar293,(undefined1  [16])aVar1,auVar7);
  local_410 = vsubps_avx(auVar243,auVar103);
  auVar7 = vshufps_avx(local_410,local_410,0xaa);
  auVar152._0_4_ = fVar70 * auVar7._0_4_;
  auVar152._4_4_ = fVar84 * auVar7._4_4_;
  auVar152._8_4_ = fVar146 * auVar7._8_4_;
  auVar152._12_4_ = fVar162 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_410,local_410,0x55);
  auVar11 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar1,auVar7);
  auVar76._0_4_ = (fVar163 + auVar171._0_4_) * 0.33333334 + auVar243._0_4_;
  auVar76._4_4_ = (fVar164 + auVar171._4_4_) * 0.33333334 + auVar243._4_4_;
  auVar76._8_4_ = (fVar101 + auVar171._8_4_) * 0.33333334 + auVar243._8_4_;
  auVar76._12_4_ = (fVar102 + auVar171._12_4_) * 0.33333334 + auVar243._12_4_;
  local_420 = vsubps_avx(auVar76,auVar103);
  auVar7 = vshufps_avx(local_420,local_420,0xaa);
  auVar214._0_4_ = auVar7._0_4_ * fVar70;
  auVar214._4_4_ = auVar7._4_4_ * fVar84;
  auVar214._8_4_ = auVar7._8_4_ * fVar146;
  auVar214._12_4_ = auVar7._12_4_ * fVar162;
  auVar7 = vshufps_avx(local_420,local_420,0x55);
  auVar130 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar1,auVar7);
  auVar232._0_4_ = (fVar167 + auVar89._0_4_) * 0.33333334;
  auVar232._4_4_ = (fVar129 + auVar89._4_4_) * 0.33333334;
  auVar232._8_4_ = (fVar144 + auVar89._8_4_) * 0.33333334;
  auVar232._12_4_ = (fVar145 + auVar89._12_4_) * 0.33333334;
  auVar17._4_4_ = fVar186;
  auVar17._0_4_ = fVar165;
  auVar17._8_4_ = fVar188;
  auVar17._12_4_ = fVar190;
  auVar116 = vsubps_avx(auVar17,auVar232);
  local_430 = vsubps_avx(auVar116,auVar103);
  auVar7 = vshufps_avx(local_430,local_430,0xaa);
  auVar233._0_4_ = auVar7._0_4_ * fVar70;
  auVar233._4_4_ = auVar7._4_4_ * fVar84;
  auVar233._8_4_ = auVar7._8_4_ * fVar146;
  auVar233._12_4_ = auVar7._12_4_ * fVar162;
  auVar7 = vshufps_avx(local_430,local_430,0x55);
  auVar72 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar1,auVar7);
  local_440 = vsubps_avx(auVar17,auVar103);
  auVar7 = vshufps_avx(local_440,local_440,0xaa);
  auVar77._0_4_ = fVar70 * auVar7._0_4_;
  auVar77._4_4_ = fVar84 * auVar7._4_4_;
  auVar77._8_4_ = fVar146 * auVar7._8_4_;
  auVar77._12_4_ = fVar162 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_440,local_440,0x55);
  auVar7 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar1,auVar7);
  local_5a0 = auVar73._0_4_;
  auVar172._4_4_ = local_5a0;
  auVar172._0_4_ = local_5a0;
  auVar172._8_4_ = local_5a0;
  auVar172._12_4_ = local_5a0;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar103 = vfmadd231ps_fma(auVar295,(undefined1  [16])aVar1,auVar172);
  local_5b0 = auVar87._0_4_;
  auVar173._4_4_ = local_5b0;
  auVar173._0_4_ = local_5b0;
  auVar173._8_4_ = local_5b0;
  auVar173._12_4_ = local_5b0;
  auVar85 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar173);
  uVar71 = local_3f0._0_4_;
  auVar174._4_4_ = uVar71;
  auVar174._0_4_ = uVar71;
  auVar174._8_4_ = uVar71;
  auVar174._12_4_ = uVar71;
  auVar108 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar174);
  uVar71 = local_400._0_4_;
  auVar175._4_4_ = uVar71;
  auVar175._0_4_ = uVar71;
  auVar175._8_4_ = uVar71;
  auVar175._12_4_ = uVar71;
  auVar147 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar175);
  uVar71 = local_410._0_4_;
  auVar176._4_4_ = uVar71;
  auVar176._0_4_ = uVar71;
  auVar176._8_4_ = uVar71;
  auVar176._12_4_ = uVar71;
  auVar148 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar176);
  uVar71 = local_420._0_4_;
  auVar177._4_4_ = uVar71;
  auVar177._0_4_ = uVar71;
  auVar177._8_4_ = uVar71;
  auVar177._12_4_ = uVar71;
  auVar130 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar1,auVar177);
  uVar71 = local_430._0_4_;
  auVar178._4_4_ = uVar71;
  auVar178._0_4_ = uVar71;
  auVar178._8_4_ = uVar71;
  auVar178._12_4_ = uVar71;
  auVar72 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar1,auVar178);
  uVar71 = local_440._0_4_;
  auVar179._4_4_ = uVar71;
  auVar179._0_4_ = uVar71;
  auVar179._8_4_ = uVar71;
  auVar179._12_4_ = uVar71;
  auVar149 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar179);
  auVar9 = vmovlhps_avx(auVar103,auVar148);
  auVar10 = vmovlhps_avx(auVar85,auVar130);
  auVar11 = vmovlhps_avx(auVar108,auVar72);
  _local_3e0 = vmovlhps_avx(auVar147,auVar149);
  auVar7 = vminps_avx(auVar9,auVar10);
  auVar8 = vminps_avx(auVar11,_local_3e0);
  auVar295 = vminps_avx(auVar7,auVar8);
  auVar7 = vmaxps_avx(auVar9,auVar10);
  auVar8 = vmaxps_avx(auVar11,_local_3e0);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vshufpd_avx(auVar295,auVar295,3);
  auVar295 = vminps_avx(auVar295,auVar8);
  auVar8 = vshufpd_avx(auVar7,auVar7,3);
  auVar8 = vmaxps_avx(auVar7,auVar8);
  auVar7 = vandps_avx(auVar196,auVar295);
  auVar8 = vandps_avx(auVar196,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar8,auVar7);
  fVar84 = auVar7._0_4_ * 9.536743e-07;
  auVar281._8_8_ = auVar103._0_8_;
  auVar281._0_8_ = auVar103._0_8_;
  auVar244._8_8_ = auVar85._0_8_;
  auVar244._0_8_ = auVar85._0_8_;
  auVar267._0_8_ = auVar108._0_8_;
  auVar267._8_8_ = auVar267._0_8_;
  auVar132._8_8_ = auVar147._0_8_;
  auVar132._0_8_ = auVar147._0_8_;
  local_2e0 = fVar84;
  fStack_2dc = fVar84;
  fStack_2d8 = fVar84;
  fStack_2d4 = fVar84;
  fStack_2d0 = fVar84;
  fStack_2cc = fVar84;
  fStack_2c8 = fVar84;
  fStack_2c4 = fVar84;
  local_300 = -fVar84;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_320 = uVar57;
  uStack_31c = uVar57;
  uStack_318 = uVar57;
  uStack_314 = uVar57;
  uStack_310 = uVar57;
  uStack_30c = uVar57;
  uStack_308 = uVar57;
  uStack_304 = uVar57;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar68 = false;
  uVar61 = 0;
  fVar70 = *(float *)(ray + k * 4 + 0x60);
  local_3b0 = vsubps_avx(auVar10,auVar9);
  local_3c0 = vsubps_avx(auVar11,auVar10);
  local_3d0 = vsubps_avx(_local_3e0,auVar11);
  local_470 = vsubps_avx(auVar243,auVar75);
  local_480 = vsubps_avx(auVar76,auVar117);
  local_490 = vsubps_avx(auVar116,auVar86);
  auVar18._4_4_ = fVar186;
  auVar18._0_4_ = fVar165;
  auVar18._8_4_ = fVar188;
  auVar18._12_4_ = fVar190;
  _local_4a0 = vsubps_avx(auVar18,auVar74);
  local_450 = ZEXT816(0x3f80000000000000);
  auVar305 = ZEXT1664(local_450);
  do {
    auVar291 = auVar305._0_16_;
    auVar7 = vshufps_avx(auVar291,auVar291,0x50);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = &DAT_3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar126._16_4_ = 0x3f800000;
    auVar126._0_16_ = auVar118;
    auVar126._20_4_ = 0x3f800000;
    auVar126._24_4_ = 0x3f800000;
    auVar126._28_4_ = 0x3f800000;
    auVar8 = vsubps_avx(auVar118,auVar7);
    fVar146 = auVar7._0_4_;
    fVar144 = auVar148._0_4_;
    auVar78._0_4_ = fVar144 * fVar146;
    fVar162 = auVar7._4_4_;
    fVar145 = auVar148._4_4_;
    auVar78._4_4_ = fVar145 * fVar162;
    fVar163 = auVar7._8_4_;
    auVar78._8_4_ = fVar144 * fVar163;
    fVar164 = auVar7._12_4_;
    auVar78._12_4_ = fVar145 * fVar164;
    fVar195 = auVar130._0_4_;
    auVar153._0_4_ = fVar195 * fVar146;
    fVar209 = auVar130._4_4_;
    auVar153._4_4_ = fVar209 * fVar162;
    auVar153._8_4_ = fVar195 * fVar163;
    auVar153._12_4_ = fVar209 * fVar164;
    fVar210 = auVar72._0_4_;
    auVar199._0_4_ = fVar210 * fVar146;
    fVar228 = auVar72._4_4_;
    auVar199._4_4_ = fVar228 * fVar162;
    auVar199._8_4_ = fVar210 * fVar163;
    auVar199._12_4_ = fVar228 * fVar164;
    fVar229 = auVar149._0_4_;
    auVar294._0_4_ = fVar229 * fVar146;
    fVar239 = auVar149._4_4_;
    auVar294._4_4_ = fVar239 * fVar162;
    auVar294._8_4_ = fVar229 * fVar163;
    auVar294._12_4_ = fVar239 * fVar164;
    auVar85 = vfmadd231ps_fma(auVar78,auVar8,auVar281);
    auVar108 = vfmadd231ps_fma(auVar153,auVar8,auVar244);
    auVar147 = vfmadd231ps_fma(auVar199,auVar8,auVar267);
    auVar217 = vfmadd231ps_fma(auVar294,auVar132,auVar8);
    local_6e0 = auVar217._0_4_;
    auVar7 = vmovshdup_avx(local_450);
    fVar146 = local_450._0_4_;
    fVar101 = (auVar7._0_4_ - fVar146) * 0.04761905;
    auVar227._4_4_ = fVar146;
    auVar227._0_4_ = fVar146;
    auVar227._8_4_ = fVar146;
    auVar227._12_4_ = fVar146;
    auVar227._16_4_ = fVar146;
    auVar227._20_4_ = fVar146;
    auVar227._24_4_ = fVar146;
    auVar227._28_4_ = fVar146;
    auVar112._0_8_ = auVar7._0_8_;
    auVar112._8_8_ = auVar112._0_8_;
    auVar112._16_8_ = auVar112._0_8_;
    auVar112._24_8_ = auVar112._0_8_;
    auVar81 = vsubps_avx(auVar112,auVar227);
    uVar71 = auVar85._0_4_;
    auVar304._4_4_ = uVar71;
    auVar304._0_4_ = uVar71;
    auVar304._8_4_ = uVar71;
    auVar304._12_4_ = uVar71;
    auVar304._16_4_ = uVar71;
    auVar304._20_4_ = uVar71;
    auVar304._24_4_ = uVar71;
    auVar304._28_4_ = uVar71;
    auVar7 = vmovshdup_avx(auVar85);
    uVar168 = auVar7._0_8_;
    auVar288._8_8_ = uVar168;
    auVar288._0_8_ = uVar168;
    auVar288._16_8_ = uVar168;
    auVar288._24_8_ = uVar168;
    fVar102 = auVar108._0_4_;
    auVar99._4_4_ = fVar102;
    auVar99._0_4_ = fVar102;
    auVar99._8_4_ = fVar102;
    auVar99._12_4_ = fVar102;
    auVar99._16_4_ = fVar102;
    auVar99._20_4_ = fVar102;
    auVar99._24_4_ = fVar102;
    auVar99._28_4_ = fVar102;
    auVar8 = vmovshdup_avx(auVar108);
    auVar183._0_8_ = auVar8._0_8_;
    auVar183._8_8_ = auVar183._0_8_;
    auVar183._16_8_ = auVar183._0_8_;
    auVar183._24_8_ = auVar183._0_8_;
    fVar264 = auVar147._0_4_;
    auVar263._4_4_ = fVar264;
    auVar263._0_4_ = fVar264;
    auVar263._8_4_ = fVar264;
    auVar263._12_4_ = fVar264;
    auVar263._16_4_ = fVar264;
    auVar263._20_4_ = fVar264;
    auVar263._24_4_ = fVar264;
    auVar263._28_4_ = fVar264;
    auVar295 = vmovshdup_avx(auVar147);
    auVar238._0_8_ = auVar295._0_8_;
    auVar238._8_8_ = auVar238._0_8_;
    auVar238._16_8_ = auVar238._0_8_;
    auVar238._24_8_ = auVar238._0_8_;
    auVar103 = vmovshdup_avx(auVar217);
    auVar211 = vfmadd132ps_fma(auVar81,auVar227,_DAT_02020f20);
    auVar81 = vsubps_avx(auVar126,ZEXT1632(auVar211));
    fVar146 = auVar211._0_4_;
    auVar297._0_4_ = fVar102 * fVar146;
    fVar162 = auVar211._4_4_;
    auVar297._4_4_ = fVar102 * fVar162;
    fVar163 = auVar211._8_4_;
    auVar297._8_4_ = fVar102 * fVar163;
    fVar164 = auVar211._12_4_;
    auVar297._12_4_ = fVar102 * fVar164;
    auVar297._16_4_ = fVar102 * 0.0;
    auVar297._20_4_ = fVar102 * 0.0;
    auVar297._24_4_ = fVar102 * 0.0;
    auVar297._28_4_ = 0;
    auVar211 = vfmadd231ps_fma(auVar297,auVar81,auVar304);
    fVar167 = auVar8._0_4_;
    auVar274._0_4_ = fVar167 * fVar146;
    fVar129 = auVar8._4_4_;
    auVar274._4_4_ = fVar129 * fVar162;
    auVar274._8_4_ = fVar167 * fVar163;
    auVar274._12_4_ = fVar129 * fVar164;
    auVar274._16_4_ = fVar167 * 0.0;
    auVar274._20_4_ = fVar129 * 0.0;
    auVar274._24_4_ = fVar167 * 0.0;
    auVar274._28_4_ = 0;
    auVar212 = vfmadd231ps_fma(auVar274,auVar81,auVar288);
    auVar83._4_4_ = fVar264 * fVar162;
    auVar83._0_4_ = fVar264 * fVar146;
    auVar83._8_4_ = fVar264 * fVar163;
    auVar83._12_4_ = fVar264 * fVar164;
    auVar83._16_4_ = fVar264 * 0.0;
    auVar83._20_4_ = fVar264 * 0.0;
    auVar83._24_4_ = fVar264 * 0.0;
    auVar83._28_4_ = auVar7._4_4_;
    auVar230 = vfmadd231ps_fma(auVar83,auVar81,auVar99);
    fVar167 = auVar295._0_4_;
    fVar129 = auVar295._4_4_;
    auVar12._4_4_ = fVar129 * fVar162;
    auVar12._0_4_ = fVar167 * fVar146;
    auVar12._8_4_ = fVar167 * fVar163;
    auVar12._12_4_ = fVar129 * fVar164;
    auVar12._16_4_ = fVar167 * 0.0;
    auVar12._20_4_ = fVar129 * 0.0;
    auVar12._24_4_ = fVar167 * 0.0;
    auVar12._28_4_ = uVar71;
    auVar135 = vfmadd231ps_fma(auVar12,auVar81,auVar183);
    auVar7 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar184._0_8_ = auVar7._0_8_;
    auVar184._8_8_ = auVar184._0_8_;
    auVar184._16_8_ = auVar184._0_8_;
    auVar184._24_8_ = auVar184._0_8_;
    auVar8 = vshufps_avx(auVar85,auVar85,0xff);
    uStack_718 = auVar8._0_8_;
    local_720 = (undefined1  [8])uStack_718;
    uStack_710 = uStack_718;
    uStack_708 = uStack_718;
    auVar13._4_4_ = fVar162 * local_6e0;
    auVar13._0_4_ = fVar146 * local_6e0;
    auVar13._8_4_ = fVar163 * local_6e0;
    auVar13._12_4_ = fVar164 * local_6e0;
    auVar13._16_4_ = local_6e0 * 0.0;
    auVar13._20_4_ = local_6e0 * 0.0;
    auVar13._24_4_ = local_6e0 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar256 = vfmadd231ps_fma(auVar13,auVar81,auVar263);
    auVar295 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar142._0_8_ = auVar295._0_8_;
    auVar142._8_8_ = auVar142._0_8_;
    auVar142._16_8_ = auVar142._0_8_;
    auVar142._24_8_ = auVar142._0_8_;
    auVar85 = vshufps_avx(auVar108,auVar108,0xff);
    auVar161._0_8_ = auVar85._0_8_;
    auVar161._8_8_ = auVar161._0_8_;
    auVar161._16_8_ = auVar161._0_8_;
    auVar161._24_8_ = auVar161._0_8_;
    fVar167 = auVar103._0_4_;
    fVar129 = auVar103._4_4_;
    auVar14._4_4_ = fVar129 * fVar162;
    auVar14._0_4_ = fVar167 * fVar146;
    auVar14._8_4_ = fVar167 * fVar163;
    auVar14._12_4_ = fVar129 * fVar164;
    auVar14._16_4_ = fVar167 * 0.0;
    auVar14._20_4_ = fVar129 * 0.0;
    auVar14._24_4_ = fVar167 * 0.0;
    auVar14._28_4_ = fVar264;
    auVar290 = vfmadd231ps_fma(auVar14,auVar81,auVar238);
    auVar15._28_4_ = fVar102;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar230._12_4_ * fVar164,
                            CONCAT48(auVar230._8_4_ * fVar163,
                                     CONCAT44(auVar230._4_4_ * fVar162,auVar230._0_4_ * fVar146))));
    auVar211 = vfmadd231ps_fma(auVar15,auVar81,ZEXT1632(auVar211));
    auVar16._28_4_ = auVar8._4_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar135._12_4_ * fVar164,
                            CONCAT48(auVar135._8_4_ * fVar163,
                                     CONCAT44(auVar135._4_4_ * fVar162,auVar135._0_4_ * fVar146))));
    auVar212 = vfmadd231ps_fma(auVar16,auVar81,ZEXT1632(auVar212));
    auVar8 = vshufps_avx(auVar147,auVar147,0xaa);
    uVar168 = auVar8._0_8_;
    auVar275._8_8_ = uVar168;
    auVar275._0_8_ = uVar168;
    auVar275._16_8_ = uVar168;
    auVar275._24_8_ = uVar168;
    auVar103 = vshufps_avx(auVar147,auVar147,0xff);
    uVar168 = auVar103._0_8_;
    auVar298._8_8_ = uVar168;
    auVar298._0_8_ = uVar168;
    auVar298._16_8_ = uVar168;
    auVar298._24_8_ = uVar168;
    auVar230 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar256._12_4_,
                                                  CONCAT48(fVar163 * auVar256._8_4_,
                                                           CONCAT44(fVar162 * auVar256._4_4_,
                                                                    fVar146 * auVar256._0_4_)))),
                               auVar81,ZEXT1632(auVar230));
    auVar108 = vshufps_avx(auVar217,auVar217,0xaa);
    auVar147 = vshufps_avx(auVar217,auVar217,0xff);
    local_6e0 = auVar147._0_4_;
    fStack_6dc = auVar147._4_4_;
    auVar276._28_4_ = fStack_6dc;
    auVar276._0_28_ =
         ZEXT1628(CONCAT412(auVar290._12_4_ * fVar164,
                            CONCAT48(auVar290._8_4_ * fVar163,
                                     CONCAT44(auVar290._4_4_ * fVar162,auVar290._0_4_ * fVar146))));
    auVar147 = vfmadd231ps_fma(auVar276,auVar81,ZEXT1632(auVar135));
    auVar217 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar230._12_4_,
                                                  CONCAT48(fVar163 * auVar230._8_4_,
                                                           CONCAT44(fVar162 * auVar230._4_4_,
                                                                    fVar146 * auVar230._0_4_)))),
                               auVar81,ZEXT1632(auVar211));
    auVar83 = vsubps_avx(ZEXT1632(auVar230),ZEXT1632(auVar211));
    auVar211 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar147._12_4_,
                                                  CONCAT48(fVar163 * auVar147._8_4_,
                                                           CONCAT44(fVar162 * auVar147._4_4_,
                                                                    fVar146 * auVar147._0_4_)))),
                               auVar81,ZEXT1632(auVar212));
    auVar82 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar212));
    fVar279 = fVar101 * auVar83._0_4_ * 3.0;
    fVar250 = fVar101 * auVar83._4_4_ * 3.0;
    auVar19._4_4_ = fVar250;
    auVar19._0_4_ = fVar279;
    fVar251 = fVar101 * auVar83._8_4_ * 3.0;
    auVar19._8_4_ = fVar251;
    fVar252 = fVar101 * auVar83._12_4_ * 3.0;
    auVar19._12_4_ = fVar252;
    fVar253 = fVar101 * auVar83._16_4_ * 3.0;
    auVar19._16_4_ = fVar253;
    fVar254 = fVar101 * auVar83._20_4_ * 3.0;
    auVar19._20_4_ = fVar254;
    fVar255 = fVar101 * auVar83._24_4_ * 3.0;
    auVar19._24_4_ = fVar255;
    auVar19._28_4_ = 0x40400000;
    local_6a0._0_4_ = fVar101 * auVar82._0_4_ * 3.0;
    local_6a0._4_4_ = fVar101 * auVar82._4_4_ * 3.0;
    fStack_698 = fVar101 * auVar82._8_4_ * 3.0;
    fStack_694 = fVar101 * auVar82._12_4_ * 3.0;
    fStack_690 = fVar101 * auVar82._16_4_ * 3.0;
    fStack_68c = fVar101 * auVar82._20_4_ * 3.0;
    fStack_688 = fVar101 * auVar82._24_4_ * 3.0;
    fStack_684 = auVar82._28_4_;
    fVar102 = auVar295._0_4_;
    fVar167 = auVar295._4_4_;
    auVar20._4_4_ = fVar167 * fVar162;
    auVar20._0_4_ = fVar102 * fVar146;
    auVar20._8_4_ = fVar102 * fVar163;
    auVar20._12_4_ = fVar167 * fVar164;
    auVar20._16_4_ = fVar102 * 0.0;
    auVar20._20_4_ = fVar167 * 0.0;
    auVar20._24_4_ = fVar102 * 0.0;
    auVar20._28_4_ = auVar83._28_4_;
    auVar295 = vfmadd231ps_fma(auVar20,auVar81,auVar184);
    fVar102 = auVar85._0_4_;
    fVar129 = auVar85._4_4_;
    auVar21._4_4_ = fVar129 * fVar162;
    auVar21._0_4_ = fVar102 * fVar146;
    auVar21._8_4_ = fVar102 * fVar163;
    auVar21._12_4_ = fVar129 * fVar164;
    auVar21._16_4_ = fVar102 * 0.0;
    auVar21._20_4_ = fVar129 * 0.0;
    auVar21._24_4_ = fVar102 * 0.0;
    auVar21._28_4_ = auVar7._4_4_;
    auVar7 = vfmadd231ps_fma(auVar21,auVar81,_local_720);
    fVar102 = auVar8._0_4_;
    fVar129 = auVar8._4_4_;
    auVar22._4_4_ = fVar129 * fVar162;
    auVar22._0_4_ = fVar102 * fVar146;
    auVar22._8_4_ = fVar102 * fVar163;
    auVar22._12_4_ = fVar129 * fVar164;
    auVar22._16_4_ = fVar102 * 0.0;
    auVar22._20_4_ = fVar129 * 0.0;
    auVar22._24_4_ = fVar102 * 0.0;
    auVar22._28_4_ = fVar101;
    auVar8 = vfmadd231ps_fma(auVar22,auVar81,auVar142);
    fVar102 = auVar103._0_4_;
    fVar264 = auVar103._4_4_;
    auVar23._4_4_ = fVar264 * fVar162;
    auVar23._0_4_ = fVar102 * fVar146;
    auVar23._8_4_ = fVar102 * fVar163;
    auVar23._12_4_ = fVar264 * fVar164;
    auVar23._16_4_ = fVar102 * 0.0;
    auVar23._20_4_ = fVar264 * 0.0;
    auVar23._24_4_ = fVar102 * 0.0;
    auVar23._28_4_ = fVar167;
    auVar103 = vfmadd231ps_fma(auVar23,auVar81,auVar161);
    local_4e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar217));
    fVar102 = auVar108._0_4_;
    fVar167 = auVar108._4_4_;
    auVar24._4_4_ = fVar167 * fVar162;
    auVar24._0_4_ = fVar102 * fVar146;
    auVar24._8_4_ = fVar102 * fVar163;
    auVar24._12_4_ = fVar167 * fVar164;
    auVar24._16_4_ = fVar102 * 0.0;
    auVar24._20_4_ = fVar167 * 0.0;
    auVar24._24_4_ = fVar102 * 0.0;
    auVar24._28_4_ = local_4e0._28_4_;
    auVar85 = vfmadd231ps_fma(auVar24,auVar81,auVar275);
    auVar14 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar211));
    auVar25._4_4_ = fVar162 * fStack_6dc;
    auVar25._0_4_ = fVar146 * local_6e0;
    auVar25._8_4_ = fVar163 * local_6e0;
    auVar25._12_4_ = fVar164 * fStack_6dc;
    auVar25._16_4_ = local_6e0 * 0.0;
    auVar25._20_4_ = fStack_6dc * 0.0;
    auVar25._24_4_ = local_6e0 * 0.0;
    auVar25._28_4_ = fVar129;
    auVar108 = vfmadd231ps_fma(auVar25,auVar81,auVar298);
    auVar26._28_4_ = fVar167;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar164 * auVar8._12_4_,
                            CONCAT48(fVar163 * auVar8._8_4_,
                                     CONCAT44(fVar162 * auVar8._4_4_,fVar146 * auVar8._0_4_))));
    auVar295 = vfmadd231ps_fma(auVar26,auVar81,ZEXT1632(auVar295));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar103._12_4_,
                                                CONCAT48(fVar163 * auVar103._8_4_,
                                                         CONCAT44(fVar162 * auVar103._4_4_,
                                                                  fVar146 * auVar103._0_4_)))),
                             auVar81,ZEXT1632(auVar7));
    fVar279 = auVar217._0_4_ + fVar279;
    fVar250 = auVar217._4_4_ + fVar250;
    fVar251 = auVar217._8_4_ + fVar251;
    fVar252 = auVar217._12_4_ + fVar252;
    fVar253 = fVar253 + 0.0;
    fVar254 = fVar254 + 0.0;
    fVar255 = fVar255 + 0.0;
    auVar27._28_4_ = 0x40400000;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar108._12_4_ * fVar164,
                            CONCAT48(auVar108._8_4_ * fVar163,
                                     CONCAT44(auVar108._4_4_ * fVar162,auVar108._0_4_ * fVar146))));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar85._12_4_,
                                                CONCAT48(fVar163 * auVar85._8_4_,
                                                         CONCAT44(fVar162 * auVar85._4_4_,
                                                                  fVar146 * auVar85._0_4_)))),
                             auVar81,ZEXT1632(auVar8));
    auVar103 = vfmadd231ps_fma(auVar27,auVar81,ZEXT1632(auVar103));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar8._12_4_,
                                                 CONCAT48(fVar163 * auVar8._8_4_,
                                                          CONCAT44(fVar162 * auVar8._4_4_,
                                                                   fVar146 * auVar8._0_4_)))),
                              auVar81,ZEXT1632(auVar295));
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar103._12_4_,
                                                  CONCAT48(fVar163 * auVar103._8_4_,
                                                           CONCAT44(fVar162 * auVar103._4_4_,
                                                                    fVar146 * auVar103._0_4_)))),
                               ZEXT1632(auVar7),auVar81);
    auVar81 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar295));
    auVar83 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar7));
    fVar146 = fVar101 * auVar81._0_4_ * 3.0;
    fVar162 = fVar101 * auVar81._4_4_ * 3.0;
    auVar28._4_4_ = fVar162;
    auVar28._0_4_ = fVar146;
    fVar163 = fVar101 * auVar81._8_4_ * 3.0;
    auVar28._8_4_ = fVar163;
    fVar164 = fVar101 * auVar81._12_4_ * 3.0;
    auVar28._12_4_ = fVar164;
    fVar264 = fVar101 * auVar81._16_4_ * 3.0;
    auVar28._16_4_ = fVar264;
    fVar277 = fVar101 * auVar81._20_4_ * 3.0;
    auVar28._20_4_ = fVar277;
    fVar278 = fVar101 * auVar81._24_4_ * 3.0;
    auVar28._24_4_ = fVar278;
    auVar28._28_4_ = 0x40400000;
    auVar208._0_4_ = fVar101 * auVar83._0_4_ * 3.0;
    auVar208._4_4_ = fVar101 * auVar83._4_4_ * 3.0;
    auVar208._8_4_ = fVar101 * auVar83._8_4_ * 3.0;
    auVar208._12_4_ = fVar101 * auVar83._12_4_ * 3.0;
    auVar208._16_4_ = fVar101 * auVar83._16_4_ * 3.0;
    auVar208._20_4_ = fVar101 * auVar83._20_4_ * 3.0;
    auVar208._24_4_ = fVar101 * auVar83._24_4_ * 3.0;
    auVar208._28_4_ = 0;
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar85));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar108));
    auVar81 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar217));
    auVar83 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar211));
    auVar12 = vsubps_avx(auVar15,local_4e0);
    fVar166 = auVar81._0_4_ + auVar12._0_4_;
    fVar187 = auVar81._4_4_ + auVar12._4_4_;
    fVar189 = auVar81._8_4_ + auVar12._8_4_;
    fVar191 = auVar81._12_4_ + auVar12._12_4_;
    fVar192 = auVar81._16_4_ + auVar12._16_4_;
    fVar193 = auVar81._20_4_ + auVar12._20_4_;
    fVar194 = auVar81._24_4_ + auVar12._24_4_;
    auVar13 = vsubps_avx(local_1c0,auVar14);
    auVar289._0_4_ = auVar83._0_4_ + auVar13._0_4_;
    auVar289._4_4_ = auVar83._4_4_ + auVar13._4_4_;
    auVar289._8_4_ = auVar83._8_4_ + auVar13._8_4_;
    auVar289._12_4_ = auVar83._12_4_ + auVar13._12_4_;
    auVar289._16_4_ = auVar83._16_4_ + auVar13._16_4_;
    auVar289._20_4_ = auVar83._20_4_ + auVar13._20_4_;
    auVar289._24_4_ = auVar83._24_4_ + auVar13._24_4_;
    auVar289._28_4_ = auVar83._28_4_ + auVar13._28_4_;
    fVar101 = auVar211._0_4_;
    local_2a0 = fVar101 + (float)local_6a0._0_4_;
    fVar102 = auVar211._4_4_;
    fStack_29c = fVar102 + (float)local_6a0._4_4_;
    fVar167 = auVar211._8_4_;
    fStack_298 = fVar167 + fStack_698;
    fVar129 = auVar211._12_4_;
    fStack_294 = fVar129 + fStack_694;
    fStack_290 = fStack_690 + 0.0;
    fStack_28c = fStack_68c + 0.0;
    fStack_288 = fStack_688 + 0.0;
    fStack_284 = auVar82._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar217);
    auVar83 = vsubps_avx(local_1e0,auVar19);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar83);
    local_200 = ZEXT1632(auVar211);
    auVar83 = vsubps_avx(local_200,_local_6a0);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar83);
    local_240._0_4_ = auVar85._0_4_ + fVar146;
    local_240._4_4_ = auVar85._4_4_ + fVar162;
    local_240._8_4_ = auVar85._8_4_ + fVar163;
    local_240._12_4_ = auVar85._12_4_ + fVar164;
    local_240._16_4_ = fVar264 + 0.0;
    local_240._20_4_ = fVar277 + 0.0;
    local_240._24_4_ = fVar278 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar276 = ZEXT1632(auVar85);
    auVar83 = vsubps_avx(auVar276,auVar28);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,auVar83);
    fVar146 = auVar108._0_4_;
    local_280._0_4_ = fVar146 + auVar208._0_4_;
    fVar162 = auVar108._4_4_;
    local_280._4_4_ = fVar162 + auVar208._4_4_;
    fVar163 = auVar108._8_4_;
    local_280._8_4_ = fVar163 + auVar208._8_4_;
    fVar164 = auVar108._12_4_;
    local_280._12_4_ = fVar164 + auVar208._12_4_;
    local_280._16_4_ = auVar208._16_4_ + 0.0;
    local_280._20_4_ = auVar208._20_4_ + 0.0;
    local_280._24_4_ = auVar208._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar83 = vsubps_avx(ZEXT1632(auVar108),auVar208);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar83);
    auVar29._4_4_ = fVar102 * fVar187;
    auVar29._0_4_ = fVar101 * fVar166;
    auVar29._8_4_ = fVar167 * fVar189;
    auVar29._12_4_ = fVar129 * fVar191;
    auVar29._16_4_ = fVar192 * 0.0;
    auVar29._20_4_ = fVar193 * 0.0;
    auVar29._24_4_ = fVar194 * 0.0;
    auVar29._28_4_ = auVar83._28_4_;
    auVar7 = vfnmadd231ps_fma(auVar29,local_1e0,auVar289);
    auVar30._4_4_ = fStack_29c * fVar187;
    auVar30._0_4_ = local_2a0 * fVar166;
    auVar30._8_4_ = fStack_298 * fVar189;
    auVar30._12_4_ = fStack_294 * fVar191;
    auVar30._16_4_ = fStack_290 * fVar192;
    auVar30._20_4_ = fStack_28c * fVar193;
    auVar30._24_4_ = fStack_288 * fVar194;
    auVar30._28_4_ = auVar16._28_4_;
    auVar50._4_4_ = fVar250;
    auVar50._0_4_ = fVar279;
    auVar50._8_4_ = fVar251;
    auVar50._12_4_ = fVar252;
    auVar50._16_4_ = fVar253;
    auVar50._20_4_ = fVar254;
    auVar50._24_4_ = fVar255;
    auVar50._28_4_ = 0x40400000;
    auVar8 = vfnmadd231ps_fma(auVar30,auVar289,auVar50);
    auVar31._4_4_ = local_2c0._4_4_ * fVar187;
    auVar31._0_4_ = local_2c0._0_4_ * fVar166;
    auVar31._8_4_ = local_2c0._8_4_ * fVar189;
    auVar31._12_4_ = local_2c0._12_4_ * fVar191;
    auVar31._16_4_ = local_2c0._16_4_ * fVar192;
    auVar31._20_4_ = local_2c0._20_4_ * fVar193;
    auVar31._24_4_ = local_2c0._24_4_ * fVar194;
    auVar31._28_4_ = fStack_284;
    auVar295 = vfnmadd231ps_fma(auVar31,local_220,auVar289);
    local_720._0_4_ = auVar14._0_4_;
    local_720._4_4_ = auVar14._4_4_;
    uStack_718._0_4_ = auVar14._8_4_;
    uStack_718._4_4_ = auVar14._12_4_;
    uStack_710._0_4_ = auVar14._16_4_;
    uStack_710._4_4_ = auVar14._20_4_;
    uStack_708._0_4_ = auVar14._24_4_;
    auVar32._4_4_ = fVar187 * (float)local_720._4_4_;
    auVar32._0_4_ = fVar166 * (float)local_720._0_4_;
    auVar32._8_4_ = fVar189 * (float)uStack_718;
    auVar32._12_4_ = fVar191 * uStack_718._4_4_;
    auVar32._16_4_ = fVar192 * (float)uStack_710;
    auVar32._20_4_ = fVar193 * uStack_710._4_4_;
    auVar32._24_4_ = fVar194 * (float)uStack_708;
    auVar32._28_4_ = local_2c0._28_4_;
    auVar103 = vfnmadd231ps_fma(auVar32,local_4e0,auVar289);
    auVar56._4_4_ = fVar162 * fVar187;
    auVar56._0_4_ = fVar146 * fVar166;
    auVar56._8_4_ = fVar163 * fVar189;
    auVar56._12_4_ = fVar164 * fVar191;
    auVar56._16_4_ = fVar192 * 0.0;
    auVar56._20_4_ = fVar193 * 0.0;
    auVar56._24_4_ = fVar194 * 0.0;
    auVar56._28_4_ = DAT_0205d4a0._28_4_;
    auVar85 = vfnmadd231ps_fma(auVar56,auVar276,auVar289);
    auVar33._4_4_ = local_280._4_4_ * fVar187;
    auVar33._0_4_ = local_280._0_4_ * fVar166;
    auVar33._8_4_ = local_280._8_4_ * fVar189;
    auVar33._12_4_ = local_280._12_4_ * fVar191;
    auVar33._16_4_ = local_280._16_4_ * fVar192;
    auVar33._20_4_ = local_280._20_4_ * fVar193;
    auVar33._24_4_ = local_280._24_4_ * fVar194;
    auVar33._28_4_ = local_4e0._28_4_;
    auVar147 = vfnmadd231ps_fma(auVar33,local_240,auVar289);
    auVar34._4_4_ = local_260._4_4_ * fVar187;
    auVar34._0_4_ = local_260._0_4_ * fVar166;
    auVar34._8_4_ = local_260._8_4_ * fVar189;
    auVar34._12_4_ = local_260._12_4_ * fVar191;
    auVar34._16_4_ = local_260._16_4_ * fVar192;
    auVar34._20_4_ = local_260._20_4_ * fVar193;
    auVar34._24_4_ = local_260._24_4_ * fVar194;
    auVar34._28_4_ = local_220._28_4_;
    auVar217 = vfnmadd231ps_fma(auVar34,auVar289,auVar16);
    auVar35._4_4_ = local_1c0._4_4_ * fVar187;
    auVar35._0_4_ = local_1c0._0_4_ * fVar166;
    auVar35._8_4_ = local_1c0._8_4_ * fVar189;
    auVar35._12_4_ = local_1c0._12_4_ * fVar191;
    auVar35._16_4_ = local_1c0._16_4_ * fVar192;
    auVar35._20_4_ = local_1c0._20_4_ * fVar193;
    auVar35._24_4_ = local_1c0._24_4_ * fVar194;
    auVar35._28_4_ = auVar81._28_4_ + auVar12._28_4_;
    auVar211 = vfnmadd231ps_fma(auVar35,auVar289,auVar15);
    auVar83 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
    auVar81 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
    auVar82 = vminps_avx(ZEXT1632(auVar295),ZEXT1632(auVar103));
    auVar82 = vminps_avx(auVar83,auVar82);
    auVar83 = vmaxps_avx(ZEXT1632(auVar295),ZEXT1632(auVar103));
    auVar81 = vmaxps_avx(auVar81,auVar83);
    auVar12 = vminps_avx(ZEXT1632(auVar85),ZEXT1632(auVar147));
    auVar83 = vmaxps_avx(ZEXT1632(auVar85),ZEXT1632(auVar147));
    auVar13 = vminps_avx(ZEXT1632(auVar217),ZEXT1632(auVar211));
    auVar12 = vminps_avx(auVar12,auVar13);
    auVar12 = vminps_avx(auVar82,auVar12);
    auVar82 = vmaxps_avx(ZEXT1632(auVar217),ZEXT1632(auVar211));
    auVar83 = vmaxps_avx(auVar83,auVar82);
    auVar83 = vmaxps_avx(auVar81,auVar83);
    auVar55._4_4_ = fStack_2dc;
    auVar55._0_4_ = local_2e0;
    auVar55._8_4_ = fStack_2d8;
    auVar55._12_4_ = fStack_2d4;
    auVar55._16_4_ = fStack_2d0;
    auVar55._20_4_ = fStack_2cc;
    auVar55._24_4_ = fStack_2c8;
    auVar55._28_4_ = fStack_2c4;
    auVar81 = vcmpps_avx(auVar12,auVar55,2);
    auVar54._4_4_ = fStack_2fc;
    auVar54._0_4_ = local_300;
    auVar54._8_4_ = fStack_2f8;
    auVar54._12_4_ = fStack_2f4;
    auVar54._16_4_ = fStack_2f0;
    auVar54._20_4_ = fStack_2ec;
    auVar54._24_4_ = fStack_2e8;
    auVar54._28_4_ = fStack_2e4;
    auVar83 = vcmpps_avx(auVar83,auVar54,5);
    auVar81 = vandps_avx(auVar83,auVar81);
    auVar83 = local_3a0 & auVar81;
    uVar59 = 0;
    if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar83 >> 0x7f,0) != '\0') ||
          (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar83 >> 0xbf,0) != '\0') ||
        (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar83[0x1f] < '\0')
    {
      auVar83 = vsubps_avx(local_4e0,local_1e0);
      auVar82 = vsubps_avx(auVar15,auVar276);
      fVar277 = auVar83._0_4_ + auVar82._0_4_;
      fVar278 = auVar83._4_4_ + auVar82._4_4_;
      fVar166 = auVar83._8_4_ + auVar82._8_4_;
      fVar187 = auVar83._12_4_ + auVar82._12_4_;
      fVar189 = auVar83._16_4_ + auVar82._16_4_;
      fVar191 = auVar83._20_4_ + auVar82._20_4_;
      fVar192 = auVar83._24_4_ + auVar82._24_4_;
      auVar12 = vsubps_avx(auVar14,local_200);
      auVar13 = vsubps_avx(local_1c0,ZEXT1632(auVar108));
      auVar100._0_4_ = auVar12._0_4_ + auVar13._0_4_;
      auVar100._4_4_ = auVar12._4_4_ + auVar13._4_4_;
      auVar100._8_4_ = auVar12._8_4_ + auVar13._8_4_;
      auVar100._12_4_ = auVar12._12_4_ + auVar13._12_4_;
      auVar100._16_4_ = auVar12._16_4_ + auVar13._16_4_;
      auVar100._20_4_ = auVar12._20_4_ + auVar13._20_4_;
      auVar100._24_4_ = auVar12._24_4_ + auVar13._24_4_;
      fVar264 = auVar13._28_4_;
      auVar100._28_4_ = auVar12._28_4_ + fVar264;
      auVar299._0_4_ = fVar101 * fVar277;
      auVar299._4_4_ = fVar102 * fVar278;
      auVar299._8_4_ = fVar167 * fVar166;
      auVar299._12_4_ = fVar129 * fVar187;
      auVar299._16_4_ = fVar189 * 0.0;
      auVar299._20_4_ = fVar191 * 0.0;
      auVar299._24_4_ = fVar192 * 0.0;
      auVar299._28_4_ = 0;
      auVar85 = vfnmadd231ps_fma(auVar299,auVar100,local_1e0);
      auVar36._4_4_ = fVar278 * fStack_29c;
      auVar36._0_4_ = fVar277 * local_2a0;
      auVar36._8_4_ = fVar166 * fStack_298;
      auVar36._12_4_ = fVar187 * fStack_294;
      auVar36._16_4_ = fVar189 * fStack_290;
      auVar36._20_4_ = fVar191 * fStack_28c;
      auVar36._24_4_ = fVar192 * fStack_288;
      auVar36._28_4_ = fVar264;
      auVar51._4_4_ = fVar250;
      auVar51._0_4_ = fVar279;
      auVar51._8_4_ = fVar251;
      auVar51._12_4_ = fVar252;
      auVar51._16_4_ = fVar253;
      auVar51._20_4_ = fVar254;
      auVar51._24_4_ = fVar255;
      auVar51._28_4_ = 0x40400000;
      auVar7 = vfnmadd213ps_fma(auVar51,auVar100,auVar36);
      auVar37._4_4_ = fVar278 * local_2c0._4_4_;
      auVar37._0_4_ = fVar277 * local_2c0._0_4_;
      auVar37._8_4_ = fVar166 * local_2c0._8_4_;
      auVar37._12_4_ = fVar187 * local_2c0._12_4_;
      auVar37._16_4_ = fVar189 * local_2c0._16_4_;
      auVar37._20_4_ = fVar191 * local_2c0._20_4_;
      auVar37._24_4_ = fVar192 * local_2c0._24_4_;
      auVar37._28_4_ = fVar264;
      auVar8 = vfnmadd213ps_fma(local_220,auVar100,auVar37);
      auVar38._4_4_ = (float)local_720._4_4_ * fVar278;
      auVar38._0_4_ = (float)local_720._0_4_ * fVar277;
      auVar38._8_4_ = (float)uStack_718 * fVar166;
      auVar38._12_4_ = uStack_718._4_4_ * fVar187;
      auVar38._16_4_ = (float)uStack_710 * fVar189;
      auVar38._20_4_ = uStack_710._4_4_ * fVar191;
      auVar38._24_4_ = (float)uStack_708 * fVar192;
      auVar38._28_4_ = fVar264;
      auVar108 = vfnmadd231ps_fma(auVar38,auVar100,local_4e0);
      auVar113._0_4_ = fVar146 * fVar277;
      auVar113._4_4_ = fVar162 * fVar278;
      auVar113._8_4_ = fVar163 * fVar166;
      auVar113._12_4_ = fVar164 * fVar187;
      auVar113._16_4_ = fVar189 * 0.0;
      auVar113._20_4_ = fVar191 * 0.0;
      auVar113._24_4_ = fVar192 * 0.0;
      auVar113._28_4_ = 0;
      auVar147 = vfnmadd231ps_fma(auVar113,auVar100,auVar276);
      auVar39._4_4_ = fVar278 * local_280._4_4_;
      auVar39._0_4_ = fVar277 * local_280._0_4_;
      auVar39._8_4_ = fVar166 * local_280._8_4_;
      auVar39._12_4_ = fVar187 * local_280._12_4_;
      auVar39._16_4_ = fVar189 * local_280._16_4_;
      auVar39._20_4_ = fVar191 * local_280._20_4_;
      auVar39._24_4_ = fVar192 * local_280._24_4_;
      auVar39._28_4_ = auVar14._28_4_;
      auVar295 = vfnmadd213ps_fma(local_240,auVar100,auVar39);
      auVar40._4_4_ = fVar278 * local_260._4_4_;
      auVar40._0_4_ = fVar277 * local_260._0_4_;
      auVar40._8_4_ = fVar166 * local_260._8_4_;
      auVar40._12_4_ = fVar187 * local_260._12_4_;
      auVar40._16_4_ = fVar189 * local_260._16_4_;
      auVar40._20_4_ = fVar191 * local_260._20_4_;
      auVar40._24_4_ = fVar192 * local_260._24_4_;
      auVar40._28_4_ = auVar14._28_4_;
      auVar103 = vfnmadd213ps_fma(auVar16,auVar100,auVar40);
      auVar41._4_4_ = local_1c0._4_4_ * fVar278;
      auVar41._0_4_ = local_1c0._0_4_ * fVar277;
      auVar41._8_4_ = local_1c0._8_4_ * fVar166;
      auVar41._12_4_ = local_1c0._12_4_ * fVar187;
      auVar41._16_4_ = local_1c0._16_4_ * fVar189;
      auVar41._20_4_ = local_1c0._20_4_ * fVar191;
      auVar41._24_4_ = local_1c0._24_4_ * fVar192;
      auVar41._28_4_ = auVar83._28_4_ + auVar82._28_4_;
      auVar217 = vfnmadd231ps_fma(auVar41,auVar100,auVar15);
      auVar82 = vminps_avx(ZEXT1632(auVar85),ZEXT1632(auVar7));
      auVar83 = vmaxps_avx(ZEXT1632(auVar85),ZEXT1632(auVar7));
      auVar12 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar108));
      auVar12 = vminps_avx(auVar82,auVar12);
      auVar82 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar108));
      auVar83 = vmaxps_avx(auVar83,auVar82);
      auVar13 = vminps_avx(ZEXT1632(auVar147),ZEXT1632(auVar295));
      auVar82 = vmaxps_avx(ZEXT1632(auVar147),ZEXT1632(auVar295));
      auVar14 = vminps_avx(ZEXT1632(auVar103),ZEXT1632(auVar217));
      auVar13 = vminps_avx(auVar13,auVar14);
      auVar13 = vminps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(ZEXT1632(auVar103),ZEXT1632(auVar217));
      auVar82 = vmaxps_avx(auVar82,auVar12);
      auVar82 = vmaxps_avx(auVar83,auVar82);
      auVar83 = vcmpps_avx(auVar13,auVar55,2);
      auVar82 = vcmpps_avx(auVar82,auVar54,5);
      auVar83 = vandps_avx(auVar82,auVar83);
      auVar81 = vandps_avx(auVar81,local_3a0);
      auVar82 = auVar81 & auVar83;
      if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar82 >> 0x7f,0) != '\0') ||
            (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar82 >> 0xbf,0) != '\0') ||
          (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar82[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar83,auVar81);
        uVar59 = vmovmskps_avx(auVar81);
      }
    }
    if (uVar59 != 0) {
      auStack_520[uVar61] = uVar59;
      uVar168 = vmovlps_avx(local_450);
      *(undefined8 *)(&uStack_380 + uVar61 * 2) = uVar168;
      uVar66 = vmovlps_avx(auVar291);
      auStack_1a0[uVar61] = uVar66;
      uVar61 = (ulong)((int)uVar61 + 1);
    }
    do {
      if ((int)uVar61 == 0) {
        if (bVar68) {
          return local_7a1;
        }
        uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar80._4_4_ = uVar71;
        auVar80._0_4_ = uVar71;
        auVar80._8_4_ = uVar71;
        auVar80._12_4_ = uVar71;
        auVar7 = vcmpps_avx(local_460,auVar80,2);
        uVar57 = vmovmskps_avx(auVar7);
        uVar57 = (uint)uVar67 & uVar57;
        local_7a1 = uVar57 != 0;
        if (!local_7a1) {
          return local_7a1;
        }
        goto LAB_0165b20c;
      }
      uVar60 = (int)uVar61 - 1;
      uVar62 = (ulong)uVar60;
      uVar65 = auStack_520[uVar62];
      uVar59 = (&uStack_380)[uVar62 * 2];
      fVar146 = afStack_37c[uVar62 * 2];
      iVar58 = 0;
      for (uVar66 = (ulong)uVar65; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        iVar58 = iVar58 + 1;
      }
      uVar65 = uVar65 - 1 & uVar65;
      if (uVar65 == 0) {
        uVar61 = (ulong)uVar60;
      }
      local_7a0._8_8_ = 0;
      local_7a0._0_8_ = auStack_1a0[uVar62];
      auVar305 = ZEXT1664(local_7a0);
      auStack_520[uVar62] = uVar65;
      fVar162 = (float)(iVar58 + 1) * 0.14285715;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * (float)iVar58 * 0.14285715)),ZEXT416(uVar59)
                               ,ZEXT416((uint)(1.0 - (float)iVar58 * 0.14285715)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar162)),ZEXT416(uVar59),
                               ZEXT416((uint)(1.0 - fVar162)));
      fVar162 = auVar8._0_4_;
      fVar163 = auVar7._0_4_;
      fVar146 = fVar162 - fVar163;
      if (0.16666667 <= fVar146) break;
      auVar295 = vshufps_avx(local_7a0,local_7a0,0x50);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar103 = vsubps_avx(auVar105,auVar295);
      fVar164 = auVar295._0_4_;
      auVar119._0_4_ = fVar164 * fVar144;
      fVar101 = auVar295._4_4_;
      auVar119._4_4_ = fVar101 * fVar145;
      fVar102 = auVar295._8_4_;
      auVar119._8_4_ = fVar102 * fVar144;
      fVar167 = auVar295._12_4_;
      auVar119._12_4_ = fVar167 * fVar145;
      auVar133._0_4_ = fVar164 * fVar195;
      auVar133._4_4_ = fVar101 * fVar209;
      auVar133._8_4_ = fVar102 * fVar195;
      auVar133._12_4_ = fVar167 * fVar209;
      auVar154._0_4_ = fVar164 * fVar210;
      auVar154._4_4_ = fVar101 * fVar228;
      auVar154._8_4_ = fVar102 * fVar210;
      auVar154._12_4_ = fVar167 * fVar228;
      auVar92._0_4_ = fVar164 * fVar229;
      auVar92._4_4_ = fVar101 * fVar239;
      auVar92._8_4_ = fVar102 * fVar229;
      auVar92._12_4_ = fVar167 * fVar239;
      auVar295 = vfmadd231ps_fma(auVar119,auVar103,auVar281);
      auVar85 = vfmadd231ps_fma(auVar133,auVar103,auVar244);
      auVar108 = vfmadd231ps_fma(auVar154,auVar103,auVar267);
      auVar103 = vfmadd231ps_fma(auVar92,auVar103,auVar132);
      auVar114._16_16_ = auVar295;
      auVar114._0_16_ = auVar295;
      auVar127._16_16_ = auVar85;
      auVar127._0_16_ = auVar85;
      auVar143._16_16_ = auVar108;
      auVar143._0_16_ = auVar108;
      auVar185._4_4_ = fVar163;
      auVar185._0_4_ = fVar163;
      auVar185._8_4_ = fVar163;
      auVar185._12_4_ = fVar163;
      auVar185._20_4_ = fVar162;
      auVar185._16_4_ = fVar162;
      auVar185._24_4_ = fVar162;
      auVar185._28_4_ = fVar162;
      auVar81 = vsubps_avx(auVar127,auVar114);
      auVar85 = vfmadd213ps_fma(auVar81,auVar185,auVar114);
      auVar81 = vsubps_avx(auVar143,auVar127);
      auVar147 = vfmadd213ps_fma(auVar81,auVar185,auVar127);
      auVar295 = vsubps_avx(auVar103,auVar108);
      auVar128._16_16_ = auVar295;
      auVar128._0_16_ = auVar295;
      auVar295 = vfmadd213ps_fma(auVar128,auVar185,auVar143);
      auVar81 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar85));
      auVar103 = vfmadd213ps_fma(auVar81,auVar185,ZEXT1632(auVar85));
      auVar81 = vsubps_avx(ZEXT1632(auVar295),ZEXT1632(auVar147));
      auVar295 = vfmadd213ps_fma(auVar81,auVar185,ZEXT1632(auVar147));
      auVar81 = vsubps_avx(ZEXT1632(auVar295),ZEXT1632(auVar103));
      auVar212 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar81,auVar185);
      fVar264 = auVar81._4_4_ * 3.0;
      fVar129 = fVar146 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar212._4_4_ + fVar129 * fVar264,
                    auVar212._0_4_ + fVar129 * auVar81._0_4_ * 3.0);
      local_4e0._8_4_ = auVar212._8_4_ + fVar129 * auVar81._8_4_ * 3.0;
      local_4e0._12_4_ = auVar212._12_4_ + fVar129 * auVar81._12_4_ * 3.0;
      auVar103 = vshufpd_avx(auVar212,auVar212,3);
      auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar295 = vsubps_avx(auVar103,auVar212);
      auVar108 = vsubps_avx(auVar85,(undefined1  [16])0x0);
      auVar106._0_4_ = auVar295._0_4_ + auVar108._0_4_;
      auVar106._4_4_ = auVar295._4_4_ + auVar108._4_4_;
      auVar106._8_4_ = auVar295._8_4_ + auVar108._8_4_;
      auVar106._12_4_ = auVar295._12_4_ + auVar108._12_4_;
      auVar295 = vshufps_avx(auVar212,auVar212,0xb1);
      auVar108 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar282._4_4_ = auVar106._0_4_;
      auVar282._0_4_ = auVar106._0_4_;
      auVar282._8_4_ = auVar106._0_4_;
      auVar282._12_4_ = auVar106._0_4_;
      auVar147 = vshufps_avx(auVar106,auVar106,0x55);
      fVar164 = auVar147._0_4_;
      auVar200._0_4_ = auVar295._0_4_ * fVar164;
      fVar101 = auVar147._4_4_;
      auVar200._4_4_ = auVar295._4_4_ * fVar101;
      fVar102 = auVar147._8_4_;
      auVar200._8_4_ = auVar295._8_4_ * fVar102;
      fVar167 = auVar147._12_4_;
      auVar200._12_4_ = auVar295._12_4_ * fVar167;
      auVar215._0_4_ = auVar108._0_4_ * fVar164;
      auVar215._4_4_ = auVar108._4_4_ * fVar101;
      auVar215._8_4_ = auVar108._8_4_ * fVar102;
      auVar215._12_4_ = auVar108._12_4_ * fVar167;
      auVar217 = vfmadd231ps_fma(auVar200,auVar282,auVar212);
      auVar211 = vfmadd231ps_fma(auVar215,auVar282,local_4e0._0_16_);
      auVar108 = vshufps_avx(auVar217,auVar217,0xe8);
      auVar147 = vshufps_avx(auVar211,auVar211,0xe8);
      auVar295 = vcmpps_avx(auVar108,auVar147,1);
      uVar59 = vextractps_avx(auVar295,0);
      auVar230 = auVar211;
      if ((uVar59 & 1) == 0) {
        auVar230 = auVar217;
      }
      auVar134._0_4_ = fVar129 * auVar81._16_4_ * 3.0;
      auVar134._4_4_ = fVar129 * fVar264;
      auVar134._8_4_ = fVar129 * auVar81._24_4_ * 3.0;
      auVar134._12_4_ = fVar129 * fVar162;
      auVar291 = vsubps_avx((undefined1  [16])0x0,auVar134);
      auVar135 = vshufps_avx(auVar291,auVar291,0xb1);
      auVar256 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar301._0_4_ = auVar135._0_4_ * fVar164;
      auVar301._4_4_ = auVar135._4_4_ * fVar101;
      auVar301._8_4_ = auVar135._8_4_ * fVar102;
      auVar301._12_4_ = auVar135._12_4_ * fVar167;
      auVar107._0_4_ = auVar256._0_4_ * fVar164;
      auVar107._4_4_ = auVar256._4_4_ * fVar101;
      auVar107._8_4_ = auVar256._8_4_ * fVar102;
      auVar107._12_4_ = auVar256._12_4_ * fVar167;
      auVar17 = vfmadd231ps_fma(auVar301,auVar282,auVar291);
      auVar18 = vfmadd231ps_fma(auVar107,(undefined1  [16])0x0,auVar282);
      auVar256 = vshufps_avx(auVar17,auVar17,0xe8);
      auVar290 = vshufps_avx(auVar18,auVar18,0xe8);
      auVar135 = vcmpps_avx(auVar256,auVar290,1);
      uVar59 = vextractps_avx(auVar135,0);
      auVar77 = auVar18;
      if ((uVar59 & 1) == 0) {
        auVar77 = auVar17;
      }
      auVar230 = vmaxss_avx(auVar77,auVar230);
      auVar108 = vminps_avx(auVar108,auVar147);
      auVar147 = vminps_avx(auVar256,auVar290);
      auVar147 = vminps_avx(auVar108,auVar147);
      auVar295 = vshufps_avx(auVar295,auVar295,0x55);
      auVar295 = vblendps_avx(auVar295,auVar135,2);
      auVar135 = vpslld_avx(auVar295,0x1f);
      auVar295 = vshufpd_avx(auVar211,auVar211,1);
      auVar295 = vinsertps_avx(auVar295,auVar18,0x9c);
      auVar108 = vshufpd_avx(auVar217,auVar217,1);
      auVar108 = vinsertps_avx(auVar108,auVar17,0x9c);
      auVar295 = vblendvps_avx(auVar108,auVar295,auVar135);
      auVar108 = vmovshdup_avx(auVar295);
      auVar295 = vmaxss_avx(auVar108,auVar295);
      fVar102 = auVar147._0_4_;
      auVar108 = vmovshdup_avx(auVar147);
      fVar101 = auVar295._0_4_;
      fVar164 = auVar230._0_4_;
      if ((0.0001 <= fVar102) || (fVar101 <= -0.0001)) {
        auVar217 = vcmpps_avx(auVar108,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar211 = vcmpps_avx(auVar147,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar217 = vorps_avx(auVar211,auVar217);
        if ((-0.0001 < fVar164 & auVar217[0]) != 0) goto LAB_0165c2a3;
        auVar217 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar295,5);
        auVar211 = vcmpps_avx(auVar108,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar217 = vorps_avx(auVar211,auVar217);
        if ((auVar217 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0165c2a3;
        bVar42 = true;
LAB_0165cdbf:
        auVar305 = ZEXT1664(local_7a0);
      }
      else {
LAB_0165c2a3:
        auVar211 = vcmpps_avx(auVar147,_DAT_01feba10,1);
        auVar135 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar217 = vcmpss_avx(auVar230,ZEXT816(0) << 0x20,1);
        auVar155._8_4_ = 0x3f800000;
        auVar155._0_8_ = &DAT_3f8000003f800000;
        auVar155._12_4_ = 0x3f800000;
        auVar216._8_4_ = 0xbf800000;
        auVar216._0_8_ = 0xbf800000bf800000;
        auVar216._12_4_ = 0xbf800000;
        auVar217 = vblendvps_avx(auVar155,auVar216,auVar217);
        auVar211 = vblendvps_avx(auVar155,auVar216,auVar211);
        fVar167 = auVar211._0_4_;
        fVar129 = auVar217._0_4_;
        auVar217 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar256 = ZEXT816(0) << 0x20;
        if ((fVar167 == fVar129) && (!NAN(fVar167) && !NAN(fVar129))) {
          auVar217 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar167 == fVar129) && (!NAN(fVar167) && !NAN(fVar129))) {
          auVar135 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar211 = vmovshdup_avx(auVar211);
        fVar264 = auVar211._0_4_;
        if ((fVar167 != fVar264) || (NAN(fVar167) || NAN(fVar264))) {
          fVar167 = auVar108._0_4_;
          if ((fVar167 != fVar102) || (NAN(fVar167) || NAN(fVar102))) {
            auVar109._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
            auVar109._8_4_ = auVar147._8_4_ ^ 0x80000000;
            auVar109._12_4_ = auVar147._12_4_ ^ 0x80000000;
            auVar136._0_4_ = -fVar102 / (fVar167 - fVar102);
            auVar136._4_12_ = auVar109._4_12_;
            auVar108 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar136._0_4_)),auVar256,auVar136);
            auVar147 = auVar108;
          }
          else {
            auVar108 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar102 == 0.0) && (auVar108 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar102))) {
              auVar108 = ZEXT816(0);
            }
            auVar147 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar102 == 0.0) && (auVar147 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar102))) {
              auVar147 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar217 = vminss_avx(auVar217,auVar108);
          auVar135 = vmaxss_avx(auVar147,auVar135);
        }
        auVar295 = vcmpss_avx(auVar295,auVar256,1);
        auVar137._8_4_ = 0x3f800000;
        auVar137._0_8_ = &DAT_3f8000003f800000;
        auVar137._12_4_ = 0x3f800000;
        auVar156._8_4_ = 0xbf800000;
        auVar156._0_8_ = 0xbf800000bf800000;
        auVar156._12_4_ = 0xbf800000;
        auVar295 = vblendvps_avx(auVar137,auVar156,auVar295);
        fVar102 = auVar295._0_4_;
        auVar295 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar129 != fVar102) || (NAN(fVar129) || NAN(fVar102))) {
          if ((fVar101 != fVar164) || (NAN(fVar101) || NAN(fVar164))) {
            auVar110._0_8_ = auVar230._0_8_ ^ 0x8000000080000000;
            auVar110._8_4_ = auVar230._8_4_ ^ 0x80000000;
            auVar110._12_4_ = auVar230._12_4_ ^ 0x80000000;
            auVar138._0_4_ = -fVar164 / (fVar101 - fVar164);
            auVar138._4_12_ = auVar110._4_12_;
            auVar108 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar138._0_4_)),auVar256,auVar138);
            auVar147 = auVar108;
          }
          else {
            auVar108 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar164 == 0.0) && (auVar108 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar164))) {
              auVar108 = ZEXT816(0);
            }
            auVar147 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar164 == 0.0) && (auVar147 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar164))) {
              auVar147 = auVar295;
            }
          }
          auVar217 = vminss_avx(auVar217,auVar108);
          auVar135 = vmaxss_avx(auVar147,auVar135);
        }
        if ((fVar264 != fVar102) || (NAN(fVar264) || NAN(fVar102))) {
          auVar217 = vminss_avx(auVar217,auVar295);
          auVar135 = vmaxss_avx(auVar295,auVar135);
        }
        auVar108 = vmaxss_avx(auVar256,auVar217);
        auVar147 = vminss_avx(auVar135,auVar295);
        bVar42 = true;
        if (auVar147._0_4_ < auVar108._0_4_) goto LAB_0165cdbf;
        auVar108 = vmaxss_avx(auVar256,ZEXT416((uint)(auVar108._0_4_ + -0.1)));
        auVar295 = vminss_avx(ZEXT416((uint)(auVar147._0_4_ + 0.1)),auVar295);
        auVar93._0_8_ = auVar212._0_8_;
        auVar93._8_8_ = auVar93._0_8_;
        auVar218._8_8_ = local_4e0._0_8_;
        auVar218._0_8_ = local_4e0._0_8_;
        auVar234._8_8_ = auVar291._0_8_;
        auVar234._0_8_ = auVar291._0_8_;
        auVar147 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
        auVar217 = vshufpd_avx(auVar291,auVar291,3);
        auVar211 = vshufps_avx(auVar108,auVar295,0);
        auVar120._8_4_ = 0x3f800000;
        auVar120._0_8_ = &DAT_3f8000003f800000;
        auVar120._12_4_ = 0x3f800000;
        auVar212 = vsubps_avx(auVar120,auVar211);
        local_6a0._0_4_ = auVar103._0_4_;
        local_6a0._4_4_ = auVar103._4_4_;
        fStack_698 = auVar103._8_4_;
        fStack_694 = auVar103._12_4_;
        fVar164 = auVar211._0_4_;
        auVar121._0_4_ = fVar164 * (float)local_6a0._0_4_;
        fVar101 = auVar211._4_4_;
        auVar121._4_4_ = fVar101 * (float)local_6a0._4_4_;
        fVar102 = auVar211._8_4_;
        auVar121._8_4_ = fVar102 * fStack_698;
        fVar167 = auVar211._12_4_;
        auVar121._12_4_ = fVar167 * fStack_694;
        auVar139._0_4_ = auVar147._0_4_ * fVar164;
        auVar139._4_4_ = auVar147._4_4_ * fVar101;
        auVar139._8_4_ = auVar147._8_4_ * fVar102;
        auVar139._12_4_ = auVar147._12_4_ * fVar167;
        auVar157._0_4_ = auVar217._0_4_ * fVar164;
        auVar157._4_4_ = auVar217._4_4_ * fVar101;
        auVar157._8_4_ = auVar217._8_4_ * fVar102;
        auVar157._12_4_ = auVar217._12_4_ * fVar167;
        local_720._0_4_ = auVar85._0_4_;
        local_720._4_4_ = auVar85._4_4_;
        uStack_718._0_4_ = auVar85._8_4_;
        uStack_718._4_4_ = auVar85._12_4_;
        auVar180._0_4_ = fVar164 * (float)local_720._0_4_;
        auVar180._4_4_ = fVar101 * (float)local_720._4_4_;
        auVar180._8_4_ = fVar102 * (float)uStack_718;
        auVar180._12_4_ = fVar167 * uStack_718._4_4_;
        auVar147 = vfmadd231ps_fma(auVar121,auVar212,auVar93);
        auVar217 = vfmadd231ps_fma(auVar139,auVar212,auVar218);
        auVar211 = vfmadd231ps_fma(auVar157,auVar212,auVar234);
        auVar212 = vfmadd231ps_fma(auVar180,auVar212,ZEXT816(0));
        auVar103 = vmovshdup_avx(local_7a0);
        auVar256 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ * auVar108._0_4_)),local_7a0,
                                   ZEXT416((uint)(1.0 - auVar108._0_4_)));
        auVar290 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ * auVar295._0_4_)),local_7a0,
                                   ZEXT416((uint)(1.0 - auVar295._0_4_)));
        fVar164 = 1.0 / fVar146;
        auVar295 = vsubps_avx(auVar217,auVar147);
        auVar201._0_4_ = auVar295._0_4_ * 3.0;
        auVar201._4_4_ = auVar295._4_4_ * 3.0;
        auVar201._8_4_ = auVar295._8_4_ * 3.0;
        auVar201._12_4_ = auVar295._12_4_ * 3.0;
        auVar295 = vsubps_avx(auVar211,auVar217);
        auVar219._0_4_ = auVar295._0_4_ * 3.0;
        auVar219._4_4_ = auVar295._4_4_ * 3.0;
        auVar219._8_4_ = auVar295._8_4_ * 3.0;
        auVar219._12_4_ = auVar295._12_4_ * 3.0;
        auVar295 = vsubps_avx(auVar212,auVar211);
        auVar235._0_4_ = auVar295._0_4_ * 3.0;
        auVar235._4_4_ = auVar295._4_4_ * 3.0;
        auVar235._8_4_ = auVar295._8_4_ * 3.0;
        auVar235._12_4_ = auVar295._12_4_ * 3.0;
        auVar103 = vminps_avx(auVar219,auVar235);
        auVar295 = vmaxps_avx(auVar219,auVar235);
        auVar103 = vminps_avx(auVar201,auVar103);
        auVar295 = vmaxps_avx(auVar201,auVar295);
        auVar85 = vshufpd_avx(auVar103,auVar103,3);
        auVar108 = vshufpd_avx(auVar295,auVar295,3);
        auVar103 = vminps_avx(auVar103,auVar85);
        auVar295 = vmaxps_avx(auVar295,auVar108);
        auVar220._0_4_ = auVar103._0_4_ * fVar164;
        auVar220._4_4_ = auVar103._4_4_ * fVar164;
        auVar220._8_4_ = auVar103._8_4_ * fVar164;
        auVar220._12_4_ = auVar103._12_4_ * fVar164;
        auVar202._0_4_ = fVar164 * auVar295._0_4_;
        auVar202._4_4_ = fVar164 * auVar295._4_4_;
        auVar202._8_4_ = fVar164 * auVar295._8_4_;
        auVar202._12_4_ = fVar164 * auVar295._12_4_;
        fVar164 = 1.0 / (auVar290._0_4_ - auVar256._0_4_);
        auVar295 = vshufpd_avx(auVar147,auVar147,3);
        auVar103 = vshufpd_avx(auVar217,auVar217,3);
        auVar85 = vshufpd_avx(auVar211,auVar211,3);
        auVar108 = vshufpd_avx(auVar212,auVar212,3);
        auVar295 = vsubps_avx(auVar295,auVar147);
        auVar147 = vsubps_avx(auVar103,auVar217);
        auVar217 = vsubps_avx(auVar85,auVar211);
        auVar108 = vsubps_avx(auVar108,auVar212);
        auVar103 = vminps_avx(auVar295,auVar147);
        auVar295 = vmaxps_avx(auVar295,auVar147);
        auVar85 = vminps_avx(auVar217,auVar108);
        auVar85 = vminps_avx(auVar103,auVar85);
        auVar103 = vmaxps_avx(auVar217,auVar108);
        auVar295 = vmaxps_avx(auVar295,auVar103);
        auVar258._0_4_ = fVar164 * auVar85._0_4_;
        auVar258._4_4_ = fVar164 * auVar85._4_4_;
        auVar258._8_4_ = fVar164 * auVar85._8_4_;
        auVar258._12_4_ = fVar164 * auVar85._12_4_;
        auVar245._0_4_ = fVar164 * auVar295._0_4_;
        auVar245._4_4_ = fVar164 * auVar295._4_4_;
        auVar245._8_4_ = fVar164 * auVar295._8_4_;
        auVar245._12_4_ = fVar164 * auVar295._12_4_;
        auVar108 = vinsertps_avx(auVar7,auVar256,0x10);
        auVar147 = vinsertps_avx(auVar8,auVar290,0x10);
        auVar79._0_4_ = (auVar108._0_4_ + auVar147._0_4_) * 0.5;
        auVar79._4_4_ = (auVar108._4_4_ + auVar147._4_4_) * 0.5;
        auVar79._8_4_ = (auVar108._8_4_ + auVar147._8_4_) * 0.5;
        auVar79._12_4_ = (auVar108._12_4_ + auVar147._12_4_) * 0.5;
        auVar122._4_4_ = auVar79._0_4_;
        auVar122._0_4_ = auVar79._0_4_;
        auVar122._8_4_ = auVar79._0_4_;
        auVar122._12_4_ = auVar79._0_4_;
        auVar295 = vfmadd213ps_fma(local_3b0,auVar122,auVar9);
        auVar103 = vfmadd213ps_fma(local_3c0,auVar122,auVar10);
        auVar85 = vfmadd213ps_fma(local_3d0,auVar122,auVar11);
        auVar8 = vsubps_avx(auVar103,auVar295);
        auVar295 = vfmadd213ps_fma(auVar8,auVar122,auVar295);
        auVar8 = vsubps_avx(auVar85,auVar103);
        auVar8 = vfmadd213ps_fma(auVar8,auVar122,auVar103);
        auVar8 = vsubps_avx(auVar8,auVar295);
        auVar295 = vfmadd231ps_fma(auVar295,auVar8,auVar122);
        auVar123._0_8_ = CONCAT44(auVar8._4_4_ * 3.0,auVar8._0_4_ * 3.0);
        auVar123._8_4_ = auVar8._8_4_ * 3.0;
        auVar123._12_4_ = auVar8._12_4_ * 3.0;
        auVar236._8_8_ = auVar295._0_8_;
        auVar236._0_8_ = auVar295._0_8_;
        auVar8 = vshufpd_avx(auVar295,auVar295,3);
        auVar295 = vshufps_avx(auVar79,auVar79,0x55);
        auVar217 = vsubps_avx(auVar8,auVar236);
        auVar212 = vfmadd231ps_fma(auVar236,auVar295,auVar217);
        auVar283._8_8_ = auVar123._0_8_;
        auVar283._0_8_ = auVar123._0_8_;
        auVar8 = vshufpd_avx(auVar123,auVar123,3);
        auVar8 = vsubps_avx(auVar8,auVar283);
        auVar211 = vfmadd213ps_fma(auVar8,auVar295,auVar283);
        auVar295 = vmovshdup_avx(auVar211);
        auVar284._0_8_ = auVar295._0_8_ ^ 0x8000000080000000;
        auVar284._8_4_ = auVar295._8_4_ ^ 0x80000000;
        auVar284._12_4_ = auVar295._12_4_ ^ 0x80000000;
        auVar103 = vmovshdup_avx(auVar217);
        auVar8 = vunpcklps_avx(auVar103,auVar284);
        auVar85 = vshufps_avx(auVar8,auVar284,4);
        auVar302._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
        auVar302._8_4_ = auVar217._8_4_ ^ 0x80000000;
        auVar302._12_4_ = auVar217._12_4_ ^ 0x80000000;
        auVar8 = vmovlhps_avx(auVar302,auVar211);
        auVar8 = vshufps_avx(auVar8,auVar211,8);
        auVar295 = vfmsub231ss_fma(ZEXT416((uint)(auVar295._0_4_ * auVar217._0_4_)),auVar103,
                                   auVar211);
        auVar140._0_4_ = auVar295._0_4_;
        auVar140._4_4_ = auVar140._0_4_;
        auVar140._8_4_ = auVar140._0_4_;
        auVar140._12_4_ = auVar140._0_4_;
        auVar295 = vdivps_avx(auVar85,auVar140);
        auVar103 = vdivps_avx(auVar8,auVar140);
        fVar102 = auVar212._0_4_;
        fVar164 = auVar295._0_4_;
        auVar8 = vshufps_avx(auVar212,auVar212,0x55);
        fVar101 = auVar103._0_4_;
        local_720._4_4_ = fVar102 * auVar295._4_4_ + auVar8._4_4_ * auVar103._4_4_;
        local_720._0_4_ = fVar102 * fVar164 + auVar8._0_4_ * fVar101;
        uStack_718._0_4_ = fVar102 * auVar295._8_4_ + auVar8._8_4_ * auVar103._8_4_;
        uStack_718._4_4_ = fVar102 * auVar295._12_4_ + auVar8._12_4_ * auVar103._12_4_;
        auVar217 = vmovshdup_avx(auVar295);
        auVar8 = vinsertps_avx(auVar220,auVar258,0x1c);
        auVar296._0_4_ = auVar217._0_4_ * auVar8._0_4_;
        auVar296._4_4_ = auVar217._4_4_ * auVar8._4_4_;
        auVar296._8_4_ = auVar217._8_4_ * auVar8._8_4_;
        auVar296._12_4_ = auVar217._12_4_ * auVar8._12_4_;
        auVar85 = vinsertps_avx(auVar202,auVar245,0x1c);
        auVar268._0_4_ = auVar217._0_4_ * auVar85._0_4_;
        auVar268._4_4_ = auVar217._4_4_ * auVar85._4_4_;
        auVar268._8_4_ = auVar217._8_4_ * auVar85._8_4_;
        auVar268._12_4_ = auVar217._12_4_ * auVar85._12_4_;
        auVar230 = vminps_avx(auVar296,auVar268);
        auVar212 = vmaxps_avx(auVar268,auVar296);
        auVar217 = vinsertps_avx(auVar258,auVar220,0x4c);
        auVar135 = vmovshdup_avx(auVar103);
        auVar211 = vinsertps_avx(auVar245,auVar202,0x4c);
        auVar246._0_4_ = auVar135._0_4_ * auVar217._0_4_;
        auVar246._4_4_ = auVar135._4_4_ * auVar217._4_4_;
        auVar246._8_4_ = auVar135._8_4_ * auVar217._8_4_;
        auVar246._12_4_ = auVar135._12_4_ * auVar217._12_4_;
        auVar259._0_4_ = auVar135._0_4_ * auVar211._0_4_;
        auVar259._4_4_ = auVar135._4_4_ * auVar211._4_4_;
        auVar259._8_4_ = auVar135._8_4_ * auVar211._8_4_;
        auVar259._12_4_ = auVar135._12_4_ * auVar211._12_4_;
        auVar135 = vminps_avx(auVar246,auVar259);
        auVar94._0_4_ = auVar135._0_4_ + auVar230._0_4_;
        auVar94._4_4_ = auVar135._4_4_ + auVar230._4_4_;
        auVar94._8_4_ = auVar135._8_4_ + auVar230._8_4_;
        auVar94._12_4_ = auVar135._12_4_ + auVar230._12_4_;
        auVar230 = vmaxps_avx(auVar259,auVar246);
        auVar247._0_4_ = auVar212._0_4_ + auVar230._0_4_;
        auVar247._4_4_ = auVar212._4_4_ + auVar230._4_4_;
        auVar247._8_4_ = auVar212._8_4_ + auVar230._8_4_;
        auVar247._12_4_ = auVar212._12_4_ + auVar230._12_4_;
        auVar260._8_8_ = 0x3f80000000000000;
        auVar260._0_8_ = 0x3f80000000000000;
        auVar212 = vsubps_avx(auVar260,auVar247);
        auVar230 = vsubps_avx(auVar260,auVar94);
        auVar135 = vsubps_avx(auVar108,auVar79);
        auVar285._0_4_ = fVar164 * auVar8._0_4_;
        auVar285._4_4_ = fVar164 * auVar8._4_4_;
        auVar285._8_4_ = fVar164 * auVar8._8_4_;
        auVar285._12_4_ = fVar164 * auVar8._12_4_;
        auVar269._0_4_ = fVar164 * auVar85._0_4_;
        auVar269._4_4_ = fVar164 * auVar85._4_4_;
        auVar269._8_4_ = fVar164 * auVar85._8_4_;
        auVar269._12_4_ = fVar164 * auVar85._12_4_;
        auVar85 = vminps_avx(auVar285,auVar269);
        auVar8 = vmaxps_avx(auVar269,auVar285);
        auVar221._0_4_ = fVar101 * auVar217._0_4_;
        auVar221._4_4_ = fVar101 * auVar217._4_4_;
        auVar221._8_4_ = fVar101 * auVar217._8_4_;
        auVar221._12_4_ = fVar101 * auVar217._12_4_;
        auVar203._0_4_ = fVar101 * auVar211._0_4_;
        auVar203._4_4_ = fVar101 * auVar211._4_4_;
        auVar203._8_4_ = fVar101 * auVar211._8_4_;
        auVar203._12_4_ = fVar101 * auVar211._12_4_;
        auVar217 = vminps_avx(auVar221,auVar203);
        auVar286._0_4_ = auVar85._0_4_ + auVar217._0_4_;
        auVar286._4_4_ = auVar85._4_4_ + auVar217._4_4_;
        auVar286._8_4_ = auVar85._8_4_ + auVar217._8_4_;
        auVar286._12_4_ = auVar85._12_4_ + auVar217._12_4_;
        auVar217 = vsubps_avx(auVar147,auVar79);
        auVar85 = vmaxps_avx(auVar203,auVar221);
        fVar102 = auVar135._0_4_;
        auVar222._0_4_ = fVar102 * auVar212._0_4_;
        fVar167 = auVar135._4_4_;
        auVar222._4_4_ = fVar167 * auVar212._4_4_;
        fVar129 = auVar135._8_4_;
        auVar222._8_4_ = fVar129 * auVar212._8_4_;
        fVar264 = auVar135._12_4_;
        auVar222._12_4_ = fVar264 * auVar212._12_4_;
        auVar204._0_4_ = auVar8._0_4_ + auVar85._0_4_;
        auVar204._4_4_ = auVar8._4_4_ + auVar85._4_4_;
        auVar204._8_4_ = auVar8._8_4_ + auVar85._8_4_;
        auVar204._12_4_ = auVar8._12_4_ + auVar85._12_4_;
        auVar270._8_8_ = 0x3f800000;
        auVar270._0_8_ = 0x3f800000;
        auVar8 = vsubps_avx(auVar270,auVar204);
        auVar85 = vsubps_avx(auVar270,auVar286);
        auVar287._0_4_ = fVar102 * auVar230._0_4_;
        auVar287._4_4_ = fVar167 * auVar230._4_4_;
        auVar287._8_4_ = fVar129 * auVar230._8_4_;
        auVar287._12_4_ = fVar264 * auVar230._12_4_;
        fVar277 = auVar217._0_4_;
        auVar248._0_4_ = fVar277 * auVar212._0_4_;
        fVar278 = auVar217._4_4_;
        auVar248._4_4_ = fVar278 * auVar212._4_4_;
        fVar279 = auVar217._8_4_;
        auVar248._8_4_ = fVar279 * auVar212._8_4_;
        fVar166 = auVar217._12_4_;
        auVar248._12_4_ = fVar166 * auVar212._12_4_;
        auVar95._0_4_ = fVar277 * auVar230._0_4_;
        auVar95._4_4_ = fVar278 * auVar230._4_4_;
        auVar95._8_4_ = fVar279 * auVar230._8_4_;
        auVar95._12_4_ = fVar166 * auVar230._12_4_;
        auVar303._0_4_ = fVar102 * auVar8._0_4_;
        auVar303._4_4_ = fVar167 * auVar8._4_4_;
        auVar303._8_4_ = fVar129 * auVar8._8_4_;
        auVar303._12_4_ = fVar264 * auVar8._12_4_;
        auVar261._0_4_ = fVar102 * auVar85._0_4_;
        auVar261._4_4_ = fVar167 * auVar85._4_4_;
        auVar261._8_4_ = fVar129 * auVar85._8_4_;
        auVar261._12_4_ = fVar264 * auVar85._12_4_;
        auVar205._0_4_ = fVar277 * auVar8._0_4_;
        auVar205._4_4_ = fVar278 * auVar8._4_4_;
        auVar205._8_4_ = fVar279 * auVar8._8_4_;
        auVar205._12_4_ = fVar166 * auVar8._12_4_;
        auVar271._0_4_ = fVar277 * auVar85._0_4_;
        auVar271._4_4_ = fVar278 * auVar85._4_4_;
        auVar271._8_4_ = fVar279 * auVar85._8_4_;
        auVar271._12_4_ = fVar166 * auVar85._12_4_;
        auVar8 = vminps_avx(auVar303,auVar261);
        auVar85 = vminps_avx(auVar205,auVar271);
        auVar8 = vminps_avx(auVar8,auVar85);
        auVar85 = vmaxps_avx(auVar261,auVar303);
        auVar217 = vminps_avx(auVar222,auVar287);
        auVar211 = vminps_avx(auVar248,auVar95);
        auVar217 = vminps_avx(auVar217,auVar211);
        auVar8 = vhaddps_avx(auVar8,auVar217);
        auVar217 = vmaxps_avx(auVar271,auVar205);
        auVar85 = vmaxps_avx(auVar217,auVar85);
        auVar217 = vmaxps_avx(auVar287,auVar222);
        auVar211 = vmaxps_avx(auVar95,auVar248);
        auVar217 = vmaxps_avx(auVar211,auVar217);
        auVar85 = vhaddps_avx(auVar85,auVar217);
        auVar217 = vshufps_avx(auVar79,auVar79,0x54);
        auVar217 = vsubps_avx(auVar217,_local_720);
        auVar8 = vshufps_avx(auVar8,auVar8,0xe8);
        auVar85 = vshufps_avx(auVar85,auVar85,0xe8);
        auVar223._0_4_ = auVar217._0_4_ + auVar8._0_4_;
        auVar223._4_4_ = auVar217._4_4_ + auVar8._4_4_;
        auVar223._8_4_ = auVar217._8_4_ + auVar8._8_4_;
        auVar223._12_4_ = auVar217._12_4_ + auVar8._12_4_;
        auVar206._0_4_ = auVar217._0_4_ + auVar85._0_4_;
        auVar206._4_4_ = auVar217._4_4_ + auVar85._4_4_;
        auVar206._8_4_ = auVar217._8_4_ + auVar85._8_4_;
        auVar206._12_4_ = auVar217._12_4_ + auVar85._12_4_;
        auVar8 = vmaxps_avx(auVar108,auVar223);
        auVar85 = vminps_avx(auVar206,auVar147);
        auVar8 = vcmpps_avx(auVar85,auVar8,1);
        auVar8 = vshufps_avx(auVar8,auVar8,0x50);
        local_7a0 = vinsertps_avx(auVar256,ZEXT416((uint)auVar290._0_4_),0x10);
        auVar305 = ZEXT1664(local_7a0);
        if ((auVar8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar8[0xf]) {
          bVar64 = 0;
          if ((fVar163 < auVar223._0_4_) && (bVar64 = 0, auVar206._0_4_ < auVar147._0_4_)) {
            auVar85 = vmovshdup_avx(auVar223);
            auVar8 = vcmpps_avx(auVar206,auVar147,1);
            bVar64 = auVar8[4] & auVar256._0_4_ < auVar85._0_4_;
          }
          if (((3 < (uint)uVar61 || fVar146 < 0.001) | bVar64) == 1) {
            lVar63 = 200;
            do {
              fVar167 = auVar217._0_4_;
              fVar102 = 1.0 - fVar167;
              fVar146 = fVar102 * fVar102 * fVar102;
              fVar163 = fVar167 * 3.0 * fVar102 * fVar102;
              fVar102 = fVar102 * fVar167 * fVar167 * 3.0;
              auVar158._4_4_ = fVar146;
              auVar158._0_4_ = fVar146;
              auVar158._8_4_ = fVar146;
              auVar158._12_4_ = fVar146;
              auVar111._4_4_ = fVar163;
              auVar111._0_4_ = fVar163;
              auVar111._8_4_ = fVar163;
              auVar111._12_4_ = fVar163;
              auVar96._4_4_ = fVar102;
              auVar96._0_4_ = fVar102;
              auVar96._8_4_ = fVar102;
              auVar96._12_4_ = fVar102;
              fVar167 = fVar167 * fVar167 * fVar167;
              auVar181._0_4_ = (float)local_3e0._0_4_ * fVar167;
              auVar181._4_4_ = (float)local_3e0._4_4_ * fVar167;
              auVar181._8_4_ = fStack_3d8 * fVar167;
              auVar181._12_4_ = fStack_3d4 * fVar167;
              auVar8 = vfmadd231ps_fma(auVar181,auVar11,auVar96);
              auVar8 = vfmadd231ps_fma(auVar8,auVar10,auVar111);
              auVar8 = vfmadd231ps_fma(auVar8,auVar9,auVar158);
              auVar97._8_8_ = auVar8._0_8_;
              auVar97._0_8_ = auVar8._0_8_;
              auVar8 = vshufpd_avx(auVar8,auVar8,3);
              auVar85 = vshufps_avx(auVar217,auVar217,0x55);
              auVar8 = vsubps_avx(auVar8,auVar97);
              auVar85 = vfmadd213ps_fma(auVar8,auVar85,auVar97);
              fVar146 = auVar85._0_4_;
              auVar8 = vshufps_avx(auVar85,auVar85,0x55);
              auVar98._0_4_ = fVar164 * fVar146 + fVar101 * auVar8._0_4_;
              auVar98._4_4_ = auVar295._4_4_ * fVar146 + auVar103._4_4_ * auVar8._4_4_;
              auVar98._8_4_ = auVar295._8_4_ * fVar146 + auVar103._8_4_ * auVar8._8_4_;
              auVar98._12_4_ = auVar295._12_4_ * fVar146 + auVar103._12_4_ * auVar8._12_4_;
              auVar217 = vsubps_avx(auVar217,auVar98);
              auVar8 = vandps_avx(auVar196,auVar85);
              auVar85 = vshufps_avx(auVar8,auVar8,0xf5);
              auVar8 = vmaxss_avx(auVar85,auVar8);
              if (auVar8._0_4_ < fVar84) {
                local_120 = auVar217._0_4_;
                if (0.0 <= local_120) {
                  auVar305 = ZEXT1664(local_7a0);
                  if (local_120 <= 1.0) {
                    auVar8 = vmovshdup_avx(auVar217);
                    fVar146 = auVar8._0_4_;
                    if ((0.0 <= fVar146) && (fVar146 <= 1.0)) {
                      auVar295 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar230 = vinsertps_avx(auVar295,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar295 = vdpps_avx(auVar230,auVar73,0x7f);
                      auVar103 = vdpps_avx(auVar230,auVar87,0x7f);
                      auVar85 = vdpps_avx(auVar230,local_3f0,0x7f);
                      auVar108 = vdpps_avx(auVar230,local_400,0x7f);
                      auVar147 = vdpps_avx(auVar230,local_410,0x7f);
                      auVar211 = vdpps_avx(auVar230,local_420,0x7f);
                      auVar212 = vdpps_avx(auVar230,local_430,0x7f);
                      auVar230 = vdpps_avx(auVar230,local_440,0x7f);
                      fVar163 = 1.0 - fVar146;
                      auVar295 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * auVar147._0_4_)),
                                                 ZEXT416((uint)fVar163),auVar295);
                      auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar211._0_4_ * fVar146)),
                                                 ZEXT416((uint)fVar163),auVar103);
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar212._0_4_ * fVar146)),
                                                ZEXT416((uint)fVar163),auVar85);
                      auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * auVar230._0_4_)),
                                                 ZEXT416((uint)fVar163),auVar108);
                      fVar101 = 1.0 - local_120;
                      fVar146 = fVar101 * local_120 * local_120 * 3.0;
                      fVar167 = local_120 * local_120 * local_120;
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * auVar108._0_4_)),
                                                ZEXT416((uint)fVar146),auVar85);
                      fVar163 = local_120 * 3.0 * fVar101 * fVar101;
                      auVar103 = vfmadd231ss_fma(auVar85,ZEXT416((uint)fVar163),auVar103);
                      fVar164 = fVar101 * fVar101 * fVar101;
                      auVar295 = vfmadd231ss_fma(auVar103,ZEXT416((uint)fVar164),auVar295);
                      fVar102 = auVar295._0_4_;
                      if ((fVar70 <= fVar102) &&
                         (fVar129 = *(float *)(ray + k * 4 + 0x100), fVar102 <= fVar129)) {
                        pGVar3 = (context->scene->geometries).items[uVar57].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          bVar69 = false;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar69 = true, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                ) {
                          auVar295 = vshufps_avx(auVar217,auVar217,0x55);
                          auVar237._8_4_ = 0x3f800000;
                          auVar237._0_8_ = &DAT_3f8000003f800000;
                          auVar237._12_4_ = 0x3f800000;
                          auVar103 = vsubps_avx(auVar237,auVar295);
                          fVar264 = auVar295._0_4_;
                          auVar249._0_4_ = fVar264 * auVar243._0_4_;
                          fVar277 = auVar295._4_4_;
                          auVar249._4_4_ = fVar277 * auVar243._4_4_;
                          fVar278 = auVar295._8_4_;
                          auVar249._8_4_ = fVar278 * auVar243._8_4_;
                          fVar279 = auVar295._12_4_;
                          auVar249._12_4_ = fVar279 * auVar243._12_4_;
                          auVar262._0_4_ = fVar264 * auVar76._0_4_;
                          auVar262._4_4_ = fVar277 * auVar76._4_4_;
                          auVar262._8_4_ = fVar278 * auVar76._8_4_;
                          auVar262._12_4_ = fVar279 * auVar76._12_4_;
                          local_620 = auVar116._0_4_;
                          fStack_61c = auVar116._4_4_;
                          fStack_618 = auVar116._8_4_;
                          fStack_614 = auVar116._12_4_;
                          auVar272._0_4_ = fVar264 * local_620;
                          auVar272._4_4_ = fVar277 * fStack_61c;
                          auVar272._8_4_ = fVar278 * fStack_618;
                          auVar272._12_4_ = fVar279 * fStack_614;
                          auVar224._0_4_ = fVar264 * fVar165;
                          auVar224._4_4_ = fVar277 * fVar186;
                          auVar224._8_4_ = fVar278 * fVar188;
                          auVar224._12_4_ = fVar279 * fVar190;
                          auVar295 = vfmadd231ps_fma(auVar249,auVar103,auVar75);
                          auVar85 = vfmadd231ps_fma(auVar262,auVar103,auVar117);
                          auVar108 = vfmadd231ps_fma(auVar272,auVar103,auVar86);
                          auVar147 = vfmadd231ps_fma(auVar224,auVar103,auVar74);
                          auVar295 = vsubps_avx(auVar85,auVar295);
                          auVar103 = vsubps_avx(auVar108,auVar85);
                          auVar85 = vsubps_avx(auVar147,auVar108);
                          auVar273._0_4_ = local_120 * auVar103._0_4_;
                          auVar273._4_4_ = local_120 * auVar103._4_4_;
                          auVar273._8_4_ = local_120 * auVar103._8_4_;
                          auVar273._12_4_ = local_120 * auVar103._12_4_;
                          auVar207._4_4_ = fVar101;
                          auVar207._0_4_ = fVar101;
                          auVar207._8_4_ = fVar101;
                          auVar207._12_4_ = fVar101;
                          auVar295 = vfmadd231ps_fma(auVar273,auVar207,auVar295);
                          auVar225._0_4_ = local_120 * auVar85._0_4_;
                          auVar225._4_4_ = local_120 * auVar85._4_4_;
                          auVar225._8_4_ = local_120 * auVar85._8_4_;
                          auVar225._12_4_ = local_120 * auVar85._12_4_;
                          auVar103 = vfmadd231ps_fma(auVar225,auVar207,auVar103);
                          auVar226._0_4_ = local_120 * auVar103._0_4_;
                          auVar226._4_4_ = local_120 * auVar103._4_4_;
                          auVar226._8_4_ = local_120 * auVar103._8_4_;
                          auVar226._12_4_ = local_120 * auVar103._12_4_;
                          auVar103 = vfmadd231ps_fma(auVar226,auVar207,auVar295);
                          auVar182._0_4_ = fVar167 * (float)local_4a0._0_4_;
                          auVar182._4_4_ = fVar167 * (float)local_4a0._4_4_;
                          auVar182._8_4_ = fVar167 * fStack_498;
                          auVar182._12_4_ = fVar167 * fStack_494;
                          auVar124._4_4_ = fVar146;
                          auVar124._0_4_ = fVar146;
                          auVar124._8_4_ = fVar146;
                          auVar124._12_4_ = fVar146;
                          auVar295 = vfmadd132ps_fma(auVar124,auVar182,local_490);
                          auVar159._4_4_ = fVar163;
                          auVar159._0_4_ = fVar163;
                          auVar159._8_4_ = fVar163;
                          auVar159._12_4_ = fVar163;
                          auVar295 = vfmadd132ps_fma(auVar159,auVar295,local_480);
                          auVar125._0_4_ = auVar103._0_4_ * 3.0;
                          auVar125._4_4_ = auVar103._4_4_ * 3.0;
                          auVar125._8_4_ = auVar103._8_4_ * 3.0;
                          auVar125._12_4_ = auVar103._12_4_ * 3.0;
                          auVar141._4_4_ = fVar164;
                          auVar141._0_4_ = fVar164;
                          auVar141._8_4_ = fVar164;
                          auVar141._12_4_ = fVar164;
                          auVar103 = vfmadd132ps_fma(auVar141,auVar295,local_470);
                          auVar295 = vshufps_avx(auVar125,auVar125,0xc9);
                          auVar160._0_4_ = auVar103._0_4_ * auVar295._0_4_;
                          auVar160._4_4_ = auVar103._4_4_ * auVar295._4_4_;
                          auVar160._8_4_ = auVar103._8_4_ * auVar295._8_4_;
                          auVar160._12_4_ = auVar103._12_4_ * auVar295._12_4_;
                          auVar295 = vshufps_avx(auVar103,auVar103,0xc9);
                          auVar103 = vfmsub231ps_fma(auVar160,auVar125,auVar295);
                          auVar295 = vmovshdup_avx(auVar103);
                          local_180 = auVar295._0_8_;
                          uStack_178 = local_180;
                          uStack_170 = local_180;
                          uStack_168 = local_180;
                          auVar295 = vshufps_avx(auVar103,auVar103,0xaa);
                          local_160 = auVar295._0_8_;
                          uStack_158 = local_160;
                          uStack_150 = local_160;
                          uStack_148 = local_160;
                          local_140 = auVar103._0_4_;
                          uStack_13c = local_140;
                          uStack_138 = local_140;
                          uStack_134 = local_140;
                          uStack_130 = local_140;
                          uStack_12c = local_140;
                          uStack_128 = local_140;
                          uStack_124 = local_140;
                          fStack_11c = local_120;
                          fStack_118 = local_120;
                          fStack_114 = local_120;
                          fStack_110 = local_120;
                          fStack_10c = local_120;
                          fStack_108 = local_120;
                          fStack_104 = local_120;
                          local_100 = auVar8._0_8_;
                          uStack_f8 = local_100;
                          uStack_f0 = local_100;
                          uStack_e8 = local_100;
                          local_e0 = CONCAT44(uStack_33c,local_340);
                          uStack_d8 = CONCAT44(uStack_334,uStack_338);
                          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                          uStack_c8 = CONCAT44(uStack_324,uStack_328);
                          local_c0 = CONCAT44(uStack_31c,local_320);
                          uStack_b8 = CONCAT44(uStack_314,uStack_318);
                          uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                          uStack_a8 = CONCAT44(uStack_304,uStack_308);
                          auVar81 = vpcmpeqd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar8));
                          uStack_9c = context->user->instID[0];
                          local_a0 = uStack_9c;
                          uStack_98 = uStack_9c;
                          uStack_94 = uStack_9c;
                          uStack_90 = uStack_9c;
                          uStack_8c = uStack_9c;
                          uStack_88 = uStack_9c;
                          uStack_84 = uStack_9c;
                          uStack_7c = context->user->instPrimID[0];
                          local_80 = uStack_7c;
                          uStack_78 = uStack_7c;
                          uStack_74 = uStack_7c;
                          uStack_70 = uStack_7c;
                          uStack_6c = uStack_7c;
                          uStack_68 = uStack_7c;
                          uStack_64 = uStack_7c;
                          *(float *)(ray + k * 4 + 0x100) = fVar102;
                          local_4c0 = local_360._0_8_;
                          uStack_4b8 = local_360._8_8_;
                          uStack_4b0 = local_360._16_8_;
                          uStack_4a8 = local_360._24_8_;
                          local_510.valid = (int *)&local_4c0;
                          local_510.geometryUserPtr = pGVar3->userPtr;
                          local_510.context = context->user;
                          local_510.ray = (RTCRayN *)ray;
                          local_510.hit = (RTCHitN *)&local_180;
                          local_510.N = 8;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->occlusionFilterN)(&local_510);
                            auVar305._8_56_ = extraout_var;
                            auVar305._0_8_ = extraout_XMM1_Qa;
                            auVar81 = vpcmpeqd_avx2(auVar305._0_32_,auVar305._0_32_);
                          }
                          auVar52._8_8_ = uStack_4b8;
                          auVar52._0_8_ = local_4c0;
                          auVar52._16_8_ = uStack_4b0;
                          auVar52._24_8_ = uStack_4a8;
                          auVar82 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar52
                                                 );
                          auVar83 = auVar81 & ~auVar82;
                          if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar83 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar83 >> 0x7f,0) == '\0') &&
                                (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar83 >> 0xbf,0) == '\0') &&
                              (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar83[0x1f]) {
                            auVar82 = auVar82 ^ auVar81;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_510);
                            }
                            auVar53._8_8_ = uStack_4b8;
                            auVar53._0_8_ = local_4c0;
                            auVar53._16_8_ = uStack_4b0;
                            auVar53._24_8_ = uStack_4a8;
                            auVar83 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                            auVar81 = vpcmpeqd_avx2(auVar83,auVar53);
                            auVar82 = vpcmpeqd_avx2(auVar83,auVar83);
                            auVar82 = auVar81 ^ auVar82;
                            auVar115._8_4_ = 0xff800000;
                            auVar115._0_8_ = 0xff800000ff800000;
                            auVar115._12_4_ = 0xff800000;
                            auVar115._16_4_ = 0xff800000;
                            auVar115._20_4_ = 0xff800000;
                            auVar115._24_4_ = 0xff800000;
                            auVar115._28_4_ = 0xff800000;
                            auVar81 = vblendvps_avx(auVar115,*(undefined1 (*) [32])
                                                              (local_510.ray + 0x100),auVar81);
                            *(undefined1 (*) [32])(local_510.ray + 0x100) = auVar81;
                          }
                          bVar48 = (auVar82 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar49 = (auVar82 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar47 = (auVar82 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar46 = SUB321(auVar82 >> 0x7f,0) != '\0';
                          bVar45 = (auVar82 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar44 = SUB321(auVar82 >> 0xbf,0) != '\0';
                          bVar43 = (auVar82 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar69 = auVar82[0x1f] < '\0';
                          if (((((((!bVar48 && !bVar49) && !bVar47) && !bVar46) && !bVar45) &&
                               !bVar44) && !bVar43) && !bVar69) {
                            *(float *)(ray + k * 4 + 0x100) = fVar129;
                          }
                          bVar69 = ((((((bVar48 || bVar49) || bVar47) || bVar46) || bVar45) ||
                                    bVar44) || bVar43) || bVar69;
                        }
                        auVar305 = ZEXT1664(local_7a0);
                        bVar68 = (bool)(bVar68 | bVar69);
                      }
                    }
                  }
                  goto LAB_0165cdd1;
                }
                break;
              }
              lVar63 = lVar63 + -1;
            } while (lVar63 != 0);
          }
          else {
            bVar42 = false;
          }
          goto LAB_0165cdbf;
        }
      }
LAB_0165cdd1:
    } while (bVar42);
    local_450 = vinsertps_avx(auVar7,ZEXT416((uint)fVar162),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }